

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O2

error<idx2::idx2_err_code> idx2::Decode(idx2_file *Idx2,params *P,buffer *OutBuf)

{
  undefined1 (*pauVar1) [16];
  brick_pool *Bp;
  undefined1 auVar4 [12];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined8 uVar5;
  undefined1 auVar6 [16];
  out_mode oVar7;
  cstr pcVar8;
  long lVar9;
  long lVar10;
  byte *pbVar11;
  long lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined1 auVar28 [32];
  undefined8 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined1 auVar34 [16];
  file_traverse *pfVar35;
  i64 iVar36;
  i32 iVar37;
  dtype dVar38;
  char cVar39;
  char cVar40;
  byte bVar41;
  byte bVar42;
  char cVar43;
  int iVar44;
  int iVar45;
  cstr pcVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  u64 uVar50;
  code *pcVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  undefined4 uVar55;
  long lVar56;
  ulong uVar57;
  short *Key;
  grid *Grid2;
  mmap_volume *Key_00;
  char *pcVar58;
  dtype dVar59;
  int iVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  chunk_traverse *pcVar64;
  byte bVar65;
  int iVar66;
  undefined8 uVar67;
  uint uVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  file_traverse *pfVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  ulong uVar78;
  brick_volume *Val;
  brick_volume *pbVar79;
  u64 uVar80;
  int iVar81;
  long lVar82;
  ulong uVar83;
  idx2_file *piVar84;
  int iVar85;
  uint uVar86;
  ushort uVar87;
  uint uVar88;
  undefined1 (*pauVar89) [32];
  params *ppVar90;
  long *in_FS_OFFSET;
  bool bVar91;
  double __x;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  error<idx2::mmap_err_code> eVar96;
  extent eVar97;
  error<idx2::idx2_err_code> eVar98;
  v3i Brick3;
  v3i Brick3_00;
  i8 N;
  bool local_3821;
  idx2_file *local_3820;
  long local_3818;
  uint local_3810;
  i16 BpKey;
  ulong local_3808;
  ulong local_3800;
  ulong local_37f8;
  uint local_37f0;
  ulong local_37e8;
  int local_37dc;
  ulong local_37d8;
  params *local_37d0;
  int local_37c4;
  int local_37c0;
  int local_37bc;
  uint local_37b8;
  uint local_37b4;
  uint local_37b0;
  undefined4 local_37ac;
  int local_37a8;
  uint local_37a4;
  ulong local_37a0;
  undefined8 local_3798;
  ulong local_3790;
  ulong local_3788;
  ulong local_3780;
  ulong local_3778;
  ulong local_3770;
  ulong local_3768;
  ulong local_3760;
  int local_3758;
  int local_3754;
  uint local_3750;
  int local_374c;
  long local_3748;
  ulong local_3740;
  long local_3738;
  ulong local_3730;
  brick_volume *local_3728;
  ulong local_3720;
  ulong local_3718;
  ulong local_3710;
  ulong local_3708;
  chunk_traverse *local_3700;
  ulong local_36f8;
  ulong local_36f0;
  long local_36e8;
  u64 BrickKey;
  extent PGrid;
  hash_table<short,_idx2::bitstream> *local_36c8;
  long local_36c0;
  u64 PKey;
  anon_union_16_2_4399d23d_for_expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code>_3
  aStack_3680;
  bool local_3670;
  grid SbGridNonExt;
  bool local_3650;
  u64 Brick;
  extent ExtentInChunks;
  extent ExtentInBricks;
  mmap_volume local_3588;
  long local_3538;
  transform_info *local_3530;
  array<idx2::subband> *local_3528;
  stack_array<idx2::array<idx2::v3<int>_>,_16> *local_3520;
  stack_array<idx2::v3<int>,_16> *local_3518;
  v3<int> *local_3510;
  long local_3508;
  array<idx2::v3<int>_> *local_3500;
  u64 local_34f8;
  ulong local_34f0;
  ulong local_34e8;
  ulong local_34e0;
  ulong local_34d8;
  long local_34d0;
  long local_34c8;
  ulong local_34c0;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Decode_cpp:362:3)>
  __ScopeGuard__362;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Decode_cpp:251:3)>
  __ScopeGuard__251;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Decode_cpp:334:3)>
  local_3498;
  grid OutGrid;
  extent VolExtentInChunks;
  extent VolExtentInBricks;
  timer DecodeTimer;
  extent Skip_1;
  u64 local_3420;
  stream_cache Streams;
  brick_traverse First_2;
  iterator BrickIt_1;
  decode_state Ds;
  extent Skip;
  int aiStack_3128 [4];
  int iStack_3118;
  int iStack_3114;
  long lStack_3110;
  int iStack_3108;
  undefined4 uStack_3104;
  long local_3100;
  iterator BrickIt;
  mmap_volume OutVol;
  decode_data D;
  chunk_traverse First_1;
  undefined8 uStack_1c48;
  undefined4 auStack_1c40 [2];
  file_traverse First;
  ulong uStack_1c08;
  u64 uStack_1c00;
  char local_1bf8 [8];
  char acStack_1bf0 [8];
  char acStack_1be8 [8];
  char acStack_1be0 [8];
  undefined1 local_1bd8 [32];
  anon_union_12_8_3dedac88_for_v3<int>_1 local_1bb8;
  dtype local_1bac;
  file_traverse FileStack [64];
  undefined1 auVar99 [12];
  undefined1 auVar100 [24];
  undefined1 auVar101 [12];
  undefined1 auVar102 [24];
  
  clock_gettime(1,(timespec *)&DecodeTimer);
  GetGrid(&OutGrid,Idx2,&P->DecodeExtent);
  mmap_volume::mmap_volume(&OutVol);
  Mallocator();
  local_3588.Vol.Buffer.Data = (byte *)0x0;
  local_3588.Vol.Buffer.Bytes = 0;
  local_3588.Vol.Buffer.Alloc = &Mallocator::Instance.super_allocator;
  local_3588.Vol.Dims = 0;
  local_3588.Vol.Type = __Invalid__;
  local_3498.Dismissed = false;
  local_37d0 = P;
  local_3498.Func.P = P;
  local_3498.Func.OutVol = &OutVol;
  if (P->OutMode == RegularGridMem) {
    local_3588.Vol.Buffer.Alloc = OutBuf->Alloc;
    local_3588.Vol.Buffer.Data = OutBuf->Data;
    local_3588.Vol.Buffer.Bytes = OutBuf->Bytes;
    local_3588.Vol.Dims = OutGrid.super_extent.Dims & 0x7fffffffffffffff;
    local_3588.Vol.Type = Idx2->DType;
  }
  else if (P->OutMode == RegularGridFile) {
    First.FileOrder = *(u64 *)Idx2->Name;
    First.PrevOrder = *(u64 *)(Idx2->Name + 8);
    First.Address = *(u64 *)(Idx2->Name + 0x28);
    uStack_1c08 = *(ulong *)(Idx2->Name + 0x30);
    uStack_1c00 = *(u64 *)(Idx2->Name + 0x38);
    First.FileTo3.field_0.field_0.Y = (int)*(undefined8 *)(Idx2->Name + 0x20);
    First.FileTo3.field_0.field_0.Z = (int)((ulong)*(undefined8 *)(Idx2->Name + 0x20) >> 0x20);
    First.FileFrom3.field_0.field_0.X = (int)*(undefined8 *)(Idx2->Name + 0x10);
    First.FileFrom3.field_0.field_0.Y = (int)((ulong)*(undefined8 *)(Idx2->Name + 0x10) >> 0x20);
    First.FileFrom3.field_0.field_0.Z = (int)*(undefined8 *)(Idx2->Name + 0x18);
    First.FileTo3.field_0.field_0.X = (int)((ulong)*(undefined8 *)(Idx2->Name + 0x18) >> 0x20);
    local_1bf8 = *(char (*) [8])Idx2->Field;
    acStack_1bf0 = *(char (*) [8])(Idx2->Field + 8);
    acStack_1be8 = *(char (*) [8])(Idx2->Field + 0x10);
    acStack_1be0 = *(char (*) [8])(Idx2->Field + 0x18);
    local_1bd8 = *(undefined1 (*) [32])(Idx2->Field + 0x20);
    local_1bb8.field_3.XY.field_0 =
         (v2<int>)((long)(OutGrid.super_extent.Dims << 0x16) >> 0xb & 0xffffffff00000000U |
                  (ulong)(uint)((long)(OutGrid.super_extent.Dims << 0x2b) >> 0x2b));
    local_1bb8.field_0.Z = (int)((long)(OutGrid.super_extent.Dims * 2) >> 0x2b);
    local_1bac = Idx2->DType;
    if (P->OutFile == (cstr)0x0) {
      pcVar8 = P->OutDir;
      pcVar46 = ToRawFileName((metadata *)&First);
      pcVar58 = (char *)(*in_FS_OFFSET + -0xc80);
      snprintf(pcVar58,0x400,"%s/%s-tolerance-%f.raw",local_37d0->DecodeTolerance,pcVar8,pcVar46);
    }
    else {
      pcVar58 = (char *)(*in_FS_OFFSET + -0xc80);
      snprintf(pcVar58,0x400,"%s/%s",P->OutDir,P->OutFile);
    }
    eVar96 = MapVolume(pcVar58,(v3i *)&local_1bb8.field_0,local_1bac,&OutVol,Write);
    printf("writing output volume to %s\n",pcVar58,eVar96._8_8_);
  }
  ppVar90 = local_37d0;
  decode_data::decode_data(&D);
  __ScopeGuard__362.Dismissed = false;
  __ScopeGuard__362.Func.D = &D;
  Mallocator();
  Init(&D,Idx2,&Mallocator::Instance.super_allocator);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = ppVar90->DecodeTolerance;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = Idx2->Tolerance;
  auVar6 = vmaxsd_avx(auVar92,auVar6);
  __x = auVar6._0_8_;
  brick_volume::brick_volume(&Ds.ParentBrick);
  uVar67 = CONCAT71((int7)((ulong)&D >> 8),Idx2->NLevels);
  local_3528 = &Idx2->Subbands;
  local_3518 = &Idx2->NBricks3;
  local_3520 = &Idx2->DecodeSubbandSpacings;
  local_3530 = &Idx2->TransformDetails;
  lVar9 = *in_FS_OFFSET;
  lVar10 = *in_FS_OFFSET;
  cVar39 = Idx2->NLevels + -1;
  iVar52 = (int)cVar39;
  auVar93._8_4_ = 1;
  auVar93._0_8_ = 0x100000001;
  auVar93._12_4_ = 1;
  uVar57 = 0;
  lVar56 = 0;
  uVar83 = 0;
  piVar84 = Idx2;
  local_3820 = Idx2;
  while( true ) {
    iVar60 = 0;
    if (0 < iVar52) {
      iVar60 = iVar52;
    }
    bVar65 = (char)uVar67 - 1;
    uVar67 = CONCAT71((int7)((ulong)uVar67 >> 8),bVar65);
    if ((char)bVar65 < '\0') break;
    if ('\x0f' < cVar39) {
LAB_0015cf24:
      pcVar58 = 
      "t &idx2::stack_array<unsigned char, 16>::operator[](int) const [t = unsigned char, N = 16]";
LAB_0015cf39:
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,pcVar58);
    }
    local_3778 = (ulong)bVar65;
    if ((piVar84->DecodeSubbandMasks).Arr[local_3778] == '\0') break;
    uVar50 = (ppVar90->DecodeExtent).From;
    uVar80 = (ppVar90->DecodeExtent).Dims;
    local_3758 = 1;
    iVar53 = 1;
    local_37dc = 1;
    while (bVar91 = iVar60 != 0, iVar60 = iVar60 + -1, bVar91) {
      local_3758 = (piVar84->GroupBrick3).field_0.field_0.X * local_3758;
      iVar53 = iVar53 * (piVar84->GroupBrick3).field_0.field_0.Y;
      local_37dc = local_37dc * (piVar84->GroupBrick3).field_0.field_0.Z;
    }
    local_3758 = (piVar84->BrickDims3).field_0.field_0.X * local_3758;
    iVar53 = iVar53 * (piVar84->BrickDims3).field_0.field_0.Y;
    local_37dc = local_37dc * (piVar84->BrickDims3).field_0.field_0.Z;
    local_3710 = local_3778 * 0xc;
    local_37f8 = (long)(uVar50 * 2) >> 0x2b;
    uVar78 = (long)(uVar50 << 0x16) >> 0xb;
    uVar88 = ((int)uVar50 << 0xb) >> 0xb;
    local_3720 = (ulong)uVar88;
    uVar68 = (uint)uVar83 | (((int)uVar80 << 0xb) >> 0xb) + (uVar88 - 1);
    local_3718 = CONCAT44(local_3718._4_4_,uVar68);
    local_36f0 = uVar78 >> 0x20;
    uVar61 = (uint)((long)(uVar50 << 0x16) >> 0x3f);
    iVar60 = (int)(uVar50 * 2 >> 0x20);
    uVar62 = iVar60 >> 0x1f;
    local_3588.MMap._8_8_ =
         ((uVar78 & 0xffffffff00000000) + ((long)(uVar80 << 0x16) >> 0xb) & 0xffffffff00000000) -
         0x100000000;
    local_37d8 = (ulong)local_3588.MMap._8_8_ >> 0x20;
    uVar63 = (uint)((long)local_3588.MMap._8_8_ >> 0x3f);
    uVar75 = (int)uVar68 / local_3758 - (int)uVar88 / local_3758;
    local_3790 = (ulong)uVar75;
    uVar77 = (uint)((long)((ulong)uVar61 << 0x20 | local_36f0) / (long)iVar53);
    iVar60 = (iVar60 >> 0xb) + (int)((long)(uVar80 * 2) >> 0x2b) + -1;
    local_3818 = CONCAT44(local_3818._4_4_,iVar60);
    uVar76 = (uint)((long)((ulong)uVar62 << 0x20 | local_37f8 & 0xffffffff) / (long)local_37dc);
    local_3768 = (ulong)(uVar76 & 0x1fffff) << 0x2a |
                 (ulong)(uVar77 & 0x1fffff) << 0x15 | (ulong)((int)uVar88 / local_3758 & 0x1fffff);
    iVar71 = (Idx2->BricksPerChunk3s).Arr[local_3778].field_0.field_0.X * local_3758;
    iVar85 = (Idx2->BricksPerChunk3s).Arr[local_3778].field_0.field_0.Y * iVar53;
    iVar69 = (Idx2->BricksPerChunk3s).Arr[local_3778].field_0.field_0.Z * local_37dc;
    local_37f0 = (Idx2->ChunksPerFile3s).Arr[local_3778].field_0.field_0.X * iVar71;
    iVar66 = (Idx2->ChunksPerFile3s).Arr[local_3778].field_0.field_0.Y * iVar85;
    iVar81 = (Idx2->ChunksPerFile3s).Arr[local_3778].field_0.field_0.Z * iVar69;
    local_3760 = (long)(int)uVar88 / (long)iVar71 & 0xffffffff;
    local_3808 = CONCAT44(local_3808._4_4_,iVar71);
    local_3800 = CONCAT44(local_3800._4_4_,iVar85);
    local_37e8 = CONCAT44(local_37e8._4_4_,iVar69);
    local_3810 = (int)uVar88 / (int)local_37f0;
    lVar12 = (long)((ulong)uVar62 << 0x20 | local_37f8 & 0xffffffff) / (long)iVar81;
    uVar83 = (ulong)uVar63 << 0x20 | local_37d8;
    ExtentInBricks.Dims =
         (ulong)((iVar60 / local_37dc - uVar76) + 1 & 0x1fffff) << 0x2a |
         (ulong)(((int)((long)((ulong)uVar63 << 0x20 | local_37d8) / (long)iVar53) - uVar77) + 1 &
                0x1fffff) << 0x15 | (ulong)(uVar75 + 1 & 0x1fffff);
    uVar77 = (uint)((long)(int)uVar88 / (long)iVar71);
    uVar75 = (uint)((long)((ulong)uVar61 << 0x20 | local_36f0) / (long)iVar85);
    uVar62 = (uint)((long)((ulong)uVar62 << 0x20 | local_37f8 & 0xffffffff) / (long)iVar69);
    ExtentInChunks.From =
         (ulong)(uVar62 & 0x1fffff) << 0x2a |
         (ulong)(uVar75 & 0x1fffff) << 0x15 | (ulong)(uVar77 & 0x1fffff);
    uVar61 = (uint)((long)((ulong)uVar61 << 0x20 | local_36f0) / (long)iVar66);
    ExtentInChunks.Dims =
         (ulong)((iVar60 / iVar69 - uVar62) + 1 & 0x1fffff) << 0x2a |
         (ulong)(((int)((long)((ulong)uVar63 << 0x20 | local_37d8) / (long)iVar85) - uVar75) + 1 &
                0x1fffff) << 0x15 | (ulong)(((int)uVar68 / iVar71 - uVar77) + 1 & 0x1fffff);
    local_36e8._0_4_ = (uint)lVar56;
    local_3588.MMap._0_8_ =
         (long)((ulong)(uint)(local_3820->Dims3).field_0.field_0.Y << 0x2b) >> 0xb;
    iVar44 = (((local_3820->Dims3).field_0.field_0.X << 0xb) >> 0xb | (uint)local_36e8) - 1;
    iVar72 = (int)((ulong)(local_3588.MMap._0_8_ + -0x100000000) >> 0x20);
    iVar54 = (((local_3820->Dims3).field_0.field_0.Z << 0xb) >> 0xb) + -1;
    VolExtentInBricks.Dims =
         (ulong)(iVar54 / local_37dc + 1U & 0x1fffff) << 0x2a |
         (ulong)(iVar72 / iVar53 + 1U & 0x1fffff) << 0x15 |
         (ulong)(iVar44 / local_3758 + 1U & 0x1fffff);
    VolExtentInBricks.From = 0;
    local_3588.MMap.Buf.Bytes = (i64)((Idx2->BricksPerChunk3s).Arr + local_3778);
    VolExtentInChunks.Dims =
         (ulong)(iVar54 / iVar69 + 1U & 0x1fffff) << 0x2a |
         (ulong)(iVar72 / iVar85 + 1U & 0x1fffff) << 0x15 | (ulong)(iVar44 / iVar71 + 1U & 0x1fffff)
    ;
    local_3588.MMap.Buf.Data = (byte *)((Idx2->ChunksPerFile3s).Arr + local_3778);
    VolExtentInChunks.From = 0;
    lVar47 = 0x28;
    do {
      *(undefined8 *)((long)&FileStack[0].FileOrder + lVar47) = 0;
      lVar47 = lVar47 + 0x30;
    } while (lVar47 != 0xc28);
    lVar47 = (long)(Idx2->NFiles3).Arr[local_3778].field_0.field_0.X;
    uVar77 = 1;
    if (lVar47 != 0) {
      uVar78 = lVar47 - 1;
      lVar47 = 0x3f;
      if (uVar78 != 0) {
        for (; uVar78 >> lVar47 == 0; lVar47 = lVar47 + -1) {
        }
      }
      uVar77 = (uint)(1L << (-((byte)lVar47 ^ 0x3f) & 0x3f));
      if (uVar78 == 0) {
        uVar77 = 1;
      }
    }
    lVar47 = (long)(Idx2->NFiles3).Arr[local_3778].field_0.field_0.Y;
    local_3708 = 0x100000000;
    if (lVar47 != 0) {
      uVar78 = lVar47 - 1;
      lVar47 = 0x3f;
      if (uVar78 != 0) {
        for (; uVar78 >> lVar47 == 0; lVar47 = lVar47 + -1) {
        }
      }
      local_3708 = 0x100000000 << (-((byte)lVar47 ^ 0x3f) & 0x3f);
      if (uVar78 == 0) {
        local_3708 = 0x100000000;
      }
    }
    lVar47 = (long)(Idx2->NFiles3).Arr[local_3778].field_0.field_0.Z;
    FileStack[0].FileTo3.field_0._8_4_ = 1;
    if (lVar47 != 0) {
      uVar78 = lVar47 - 1;
      lVar47 = 0x3f;
      if (uVar78 != 0) {
        for (; uVar78 >> lVar47 == 0; lVar47 = lVar47 + -1) {
        }
      }
      FileStack[0].FileTo3.field_0._8_4_ = (int)(1L << (-((byte)lVar47 ^ 0x3f) & 0x3f));
      if (uVar78 == 0) {
        FileStack[0].FileTo3.field_0._8_4_ = 1;
      }
    }
    lVar47 = lVar12 << 0x2b;
    local_3788._0_4_ = (uint)uVar57;
    FileStack[0].FileOrder = (local_3820->FilesOrder).Arr[local_3778];
    FileStack[0].PrevOrder = FileStack[0].FileOrder;
    FileStack[0].FileFrom3.field_0.field_3.XY.field_0 = (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
    FileStack[0].FileFrom3.field_0.field_0.Z = 0;
    FileStack[0].FileTo3.field_0.field_3.XY.field_0 = (uVar77 | (uint)local_3788) | local_3708;
    FileStack[0].Address = 0;
    lVar82 = (ulong)(uVar61 & 0x1fffff) << 0x2b;
    local_3748 = lVar47 >> 0x2b;
    iVar44 = (int)((long)((ulong)(local_3810 & 0x1fffff) << 0x2b) >> 0x2b);
    iVar54 = ((int)((((int)uVar68 / (int)local_37f0 - local_3810) + 1) * 0x800) >> 0xb) + iVar44;
    local_37a0 = (ulong)(uint)((int)((long)((ulong)((iVar60 / iVar81 - (int)lVar12) + 1) << 0x2b) >>
                                    0x2b) + (int)(lVar47 >> 0x2b));
    local_3538 = (long)(char)bVar65;
    local_3588.MMap.Buf.Alloc =
         (allocator *)((ulong)(1 << (bVar65 & 0x1f) & 0x1fffff) * 0x40000200001);
    uVar78 = 0;
    piVar84 = local_3820;
    ppVar90 = local_37d0;
    local_3798 = uVar67;
    local_3788 = uVar57;
    local_36e8 = lVar56;
    ExtentInBricks.From = local_3768;
    while (-1 < (int)uVar78) {
      uVar49 = uVar78 & 0xffffffff;
      pfVar74 = FileStack + uVar49;
      uVar57 = pfVar74->FileOrder;
      uVar48 = uVar57 >> 2;
      pfVar74->FileOrder = uVar48;
      uVar77 = (uint)uVar57 & 3;
      if (uVar77 == 3) {
        if (uVar48 == 3) {
          pfVar74->FileOrder = FileStack[uVar49].PrevOrder;
        }
        else {
          FileStack[uVar49].PrevOrder = uVar48;
        }
      }
      else {
        local_3780 = (ulong)((int)uVar78 - 1);
        iVar60 = FileStack[uVar49].FileFrom3.field_0.field_0.X;
        if (((FileStack[uVar49].FileTo3.field_0.field_0.X - iVar60 == 1) &&
            (iVar69 = FileStack[uVar49].FileFrom3.field_0.field_0.Y,
            FileStack[uVar49].FileTo3.field_0.field_0.Y - iVar69 == 1)) &&
           (iVar71 = FileStack[uVar49].FileFrom3.field_0.field_0.Z,
           FileStack[uVar49].FileTo3.field_0.field_0.Z - iVar71 == 1)) {
          lVar56 = 0x38;
          do {
            *(undefined8 *)((long)&uStack_1c48 + lVar56) = 0;
            *(undefined4 *)((long)auStack_1c40 + lVar56) = 0;
            *(undefined8 *)((long)&First.FileOrder + lVar56) = 0;
            lVar56 = lVar56 + 0x40;
          } while (lVar56 != 0x1038);
          iVar72 = (((anon_union_12_8_3dedac88_for_v3<int>_1 *)local_3588.MMap.Buf.Data)->field_0).X
          ;
          iVar81 = 1;
          if ((long)iVar72 != 0) {
            uVar57 = (long)iVar72 - 1;
            lVar56 = 0x3f;
            if (uVar57 != 0) {
              for (; uVar57 >> lVar56 == 0; lVar56 = lVar56 + -1) {
              }
            }
            iVar81 = (int)(1L << (-((byte)lVar56 ^ 0x3f) & 0x3f));
            if (uVar57 == 0) {
              iVar81 = 1;
            }
          }
          iVar85 = (((anon_union_12_8_3dedac88_for_v3<int>_1 *)local_3588.MMap.Buf.Data)->field_0).Y
          ;
          iVar45 = 1;
          if ((long)iVar85 != 0) {
            uVar57 = (long)iVar85 - 1;
            lVar56 = 0x3f;
            if (uVar57 != 0) {
              for (; uVar57 >> lVar56 == 0; lVar56 = lVar56 + -1) {
              }
            }
            iVar45 = (int)(1L << (-((byte)lVar56 ^ 0x3f) & 0x3f));
            if (uVar57 == 0) {
              iVar45 = 1;
            }
          }
          iVar70 = (((anon_union_12_8_3dedac88_for_v3<int>_1 *)local_3588.MMap.Buf.Data)->field_0).Z
          ;
          iVar73 = 1;
          if ((long)iVar70 != 0) {
            uVar57 = (long)iVar70 - 1;
            lVar56 = 0x3f;
            if (uVar57 != 0) {
              for (; uVar57 >> lVar56 == 0; lVar56 = lVar56 + -1) {
              }
            }
            iVar73 = (int)(1L << (-((byte)lVar56 ^ 0x3f) & 0x3f));
            if (uVar57 == 0) {
              iVar73 = 1;
            }
          }
          First.FileOrder = (piVar84->ChunksOrderInFile).Arr[local_3778];
          First.FileFrom3.field_0.field_0.X = iVar72 * iVar60;
          First.FileFrom3.field_0.field_0.Y = iVar85 * iVar69;
          First.FileFrom3.field_0.field_0.Z = iVar70 * iVar71;
          First.PrevOrder = First.FileOrder;
          First.FileTo3.field_0.field_0.X = iVar81 + First.FileFrom3.field_0.field_0.X;
          First.FileTo3.field_0.field_0.Y = iVar45 + First.FileFrom3.field_0.field_0.Y;
          First.FileTo3.field_0.field_0.Z = iVar73 + First.FileFrom3.field_0.field_0.Z;
          First.Address = 0;
          uStack_1c08 = uStack_1c08 & 0xffffffff00000000;
          uStack_1c00 = 0;
          uVar57 = 0;
          while (uVar78 = local_3780, uVar67 = local_3798, -1 < (int)uVar57) {
            lVar56 = uVar57 * 0x40;
            pauVar89 = (undefined1 (*) [32])((long)&First + lVar56);
            uVar78 = *(ulong *)*pauVar89;
            uVar49 = uVar78 >> 2;
            *(ulong *)*pauVar89 = uVar49;
            uVar77 = (uint)uVar78 & 3;
            if (uVar77 == 3) {
              if (uVar49 == 3) {
                *(undefined8 *)*pauVar89 = *(undefined8 *)((long)&First + lVar56 + 8);
              }
              else {
                *(ulong *)((long)&First + lVar56 + 8) = uVar49;
              }
            }
            else {
              local_3740 = (ulong)((int)uVar57 - 1);
              iVar60 = *(int *)((long)&First + lVar56 + 0x10);
              if (((*(int *)((long)&First + lVar56 + 0x1c) - iVar60 == 1) &&
                  (iVar69 = *(int *)((long)&First + lVar56 + 0x14),
                  *(int *)((long)&First + lVar56 + 0x20) - iVar69 == 1)) &&
                 (iVar71 = *(int *)((long)&First + lVar56 + 0x18),
                 *(int *)((long)&First + lVar56 + 0x24) - iVar71 == 1)) {
                lVar56 = 0x38;
                do {
                  *(undefined8 *)
                   ((long)&D.NSignificantBlocks.super___atomic_base<long>._M_i + lVar56) = 0;
                  *(undefined4 *)
                   ((long)&D.NInsignificantSubbands.super___atomic_base<long>._M_i + lVar56) = 0;
                  *(undefined8 *)((long)&First_1.ChunkOrder + lVar56) = 0;
                  lVar56 = lVar56 + 0x40;
                } while (lVar56 != 0x1038);
                iVar72 = (((anon_union_12_8_3dedac88_for_v3<int>_1 *)local_3588.MMap.Buf.Bytes)->
                         field_0).X;
                iVar81 = 1;
                if ((long)iVar72 != 0) {
                  uVar57 = (long)iVar72 - 1;
                  lVar56 = 0x3f;
                  if (uVar57 != 0) {
                    for (; uVar57 >> lVar56 == 0; lVar56 = lVar56 + -1) {
                    }
                  }
                  iVar81 = (int)(1L << (-((byte)lVar56 ^ 0x3f) & 0x3f));
                  if (uVar57 == 0) {
                    iVar81 = 1;
                  }
                }
                iVar85 = (((anon_union_12_8_3dedac88_for_v3<int>_1 *)local_3588.MMap.Buf.Bytes)->
                         field_0).Y;
                iVar45 = 1;
                if ((long)iVar85 != 0) {
                  uVar57 = (long)iVar85 - 1;
                  lVar56 = 0x3f;
                  if (uVar57 != 0) {
                    for (; uVar57 >> lVar56 == 0; lVar56 = lVar56 + -1) {
                    }
                  }
                  iVar45 = (int)(1L << (-((byte)lVar56 ^ 0x3f) & 0x3f));
                  if (uVar57 == 0) {
                    iVar45 = 1;
                  }
                }
                iVar70 = (((anon_union_12_8_3dedac88_for_v3<int>_1 *)local_3588.MMap.Buf.Bytes)->
                         field_0).Z;
                iVar73 = 1;
                if ((long)iVar70 != 0) {
                  uVar57 = (long)iVar70 - 1;
                  lVar56 = 0x3f;
                  if (uVar57 != 0) {
                    for (; uVar57 >> lVar56 == 0; lVar56 = lVar56 + -1) {
                    }
                  }
                  iVar73 = (int)(1L << (-((byte)lVar56 ^ 0x3f) & 0x3f));
                  if (uVar57 == 0) {
                    iVar73 = 1;
                  }
                }
                First_1.ChunkOrder = (piVar84->BricksOrderInChunk).Arr[local_3778];
                First_1.ChunkFrom3.field_0.field_0.X = iVar72 * iVar60;
                First_1.ChunkFrom3.field_0.field_0.Y = iVar85 * iVar69;
                First_1.ChunkFrom3.field_0.field_0.Z = iVar70 * iVar71;
                First_1.ChunkTo3.field_0.field_0.X = iVar81 + First_1.ChunkFrom3.field_0.field_0.X;
                Val = (brick_volume *)(ulong)(uint)First_1.ChunkTo3.field_0.field_0.X;
                First_1.PrevOrder = First_1.ChunkOrder;
                First_1.ChunkTo3.field_0.field_0.Y = iVar45 + First_1.ChunkFrom3.field_0.field_0.Y;
                First_1.ChunkTo3.field_0.field_0.Z = iVar73 + First_1.ChunkFrom3.field_0.field_0.Z;
                First_1.NChunksBefore = 0;
                First_1.ChunkInFile = 0;
                First_1.Address = 0;
                uVar57 = 0;
                while (-1 < (int)uVar57) {
                  uVar49 = uVar57 & 0xffffffff;
                  pcVar64 = &First_1 + uVar49;
                  uVar78 = pcVar64->ChunkOrder;
                  uVar48 = uVar78 >> 2;
                  pcVar64->ChunkOrder = uVar48;
                  uVar77 = (uint)uVar78 & 3;
                  if (uVar77 == 3) {
                    if (uVar48 == 3) {
                      pcVar64->ChunkOrder = (&First_1)[uVar49].PrevOrder;
                    }
                    else {
                      (&First_1)[uVar49].PrevOrder = uVar48;
                    }
                  }
                  else {
                    local_3770 = (ulong)((int)uVar57 - 1);
                    auVar94._8_8_ = 0;
                    auVar94._0_8_ = (&First_1)[uVar49].ChunkTo3.field_0.field_3.XY.field_0;
                    auVar95._8_8_ = 0;
                    auVar95._0_8_ = (&First_1)[uVar49].ChunkFrom3.field_0.field_3.XY.field_0;
                    auVar6 = vpsubd_avx(auVar94,auVar95);
                    auVar6 = vpcmpeqd_avx(auVar6,auVar93);
                    auVar6 = vpmovsxdq_avx(auVar6);
                    uVar62 = vmovmskpd_avx(auVar6);
                    local_3700 = pcVar64;
                    if ((((uVar62 & 1) == 0) || ((byte)((byte)uVar62 >> 1) == 0)) ||
                       (uVar62 = (&First_1)[uVar49].ChunkFrom3.field_0.field_0.Z,
                       (&First_1)[uVar49].ChunkTo3.field_0.field_0.Z - uVar62 != 1)) {
                      First_2.BrickOrder = pcVar64->ChunkOrder;
                      First_2.PrevOrder = (&First_1)[uVar49].PrevOrder;
                      uVar78 = *(ulong *)&(&First_1)[uVar49].ChunkFrom3.field_0;
                      uVar67 = *(undefined8 *)((long)&(&First_1)[uVar49].ChunkFrom3.field_0 + 8);
                      uVar13 = *(undefined8 *)((long)&(&First_1)[uVar49].ChunkTo3.field_0 + 4);
                      First_2.NBricksBefore = (&First_1)[uVar49].NChunksBefore;
                      First_2.Address = (&First_1)[uVar49].Address;
                      First_2.BrickTo3.field_0.field_0.Y = (int)uVar13;
                      First_2.BrickTo3.field_0.field_0.Z = (int)((ulong)uVar13 >> 0x20);
                      First_2.BrickInChunk = (i32)*(undefined8 *)&(&First_1)[uVar49].ChunkInFile;
                      First_2._52_4_ =
                           SUB84((ulong)*(undefined8 *)&(&First_1)[uVar49].ChunkInFile >> 0x20,0);
                      First_2.BrickFrom3.field_0.field_0.X = (int)uVar78;
                      First_2.BrickFrom3.field_0.field_0.Y = (int)(uVar78 >> 0x20);
                      First_2.BrickFrom3.field_0.field_0.Z = (int)uVar67;
                      First_2.BrickTo3.field_0.field_0.X = (int)((ulong)uVar67 >> 0x20);
                      auVar2 = *(undefined1 (*) [32])pcVar64;
                      auVar3 = *(undefined1 (*) [32])
                                ((long)&(&First_1)[uVar49].ChunkFrom3.field_0 + 8);
                      iStack_3118 = auVar3._8_4_;
                      iStack_3114 = auVar3._12_4_;
                      lStack_3110 = auVar3._16_8_;
                      iStack_3108 = auVar3._24_4_;
                      uStack_3104 = auVar3._28_4_;
                      Skip.From = auVar2._0_8_;
                      Skip.Dims = auVar2._8_8_;
                      aiStack_3128[0] = auVar2._16_4_;
                      aiStack_3128[1] = auVar2._20_4_;
                      aiStack_3128[2] = auVar2._24_4_;
                      aiStack_3128[3] = auVar2._28_4_;
                      uVar48 = (ulong)(uVar77 << 2);
                      iVar60 = *(int *)((long)&(&First_1)[uVar49].ChunkFrom3.field_0 + uVar48);
                      iVar60 = (*(int *)((long)&(&First_1)[uVar49].ChunkTo3.field_0 + uVar48) -
                               iVar60) / 2 + iVar60;
                      *(int *)((long)&First_2.BrickTo3.field_0 + uVar48) = iVar60;
                      iVar36 = First_2.NBricksBefore;
                      *(int *)((long)aiStack_3128 + uVar48) = iVar60;
                      local_3808 = uVar78 & 0xffffffff;
                      local_37e8 = (ulong)(uint)First_2.BrickFrom3.field_0.field_0.Y;
                      local_37f0 = First_2.BrickTo3.field_0.field_0.X;
                      uVar77 = First_2.BrickTo3.field_0.field_0.X - First_2.BrickFrom3.field_0._0_4_
                      ;
                      local_37d8 = CONCAT44(local_37d8._4_4_,First_2.BrickTo3.field_0.field_0.Y);
                      uVar63 = First_2.BrickTo3.field_0.field_0.Y - First_2.BrickFrom3.field_0._4_4_
                      ;
                      local_3818 = CONCAT44(local_3818._4_4_,First_2.BrickTo3.field_0.field_0.Z);
                      uVar62 = First_2.BrickTo3.field_0.field_0.Z - First_2.BrickFrom3.field_0._8_4_
                      ;
                      local_3800 = CONCAT44(local_3800._4_4_,First_2.BrickFrom3.field_0.field_0.Z);
                      Skip_1.From = (ulong)(First_2.BrickFrom3.field_0.field_0.Z & 0x1fffff) << 0x2a
                                    | (local_37e8 & 0x1fffff) << 0x15 | uVar78 & 0x1fffff;
                      Skip_1.Dims = (ulong)(uVar62 & 0x1fffff) << 0x2a |
                                    (ulong)(uVar63 & 0x1fffff) << 0x15 | (ulong)(uVar77 & 0x1fffff);
                      eVar97 = Crop<idx2::extent,idx2::extent>(&Skip_1,&ExtentInBricks);
                      iVar37 = First_2.BrickInChunk;
                      uVar50 = eVar97.Dims;
                      lStack_3110 = ((long)(uVar50 << 0x16) >> 0x2b) *
                                    ((long)(uVar50 << 0x2b) >> 0x2b) * ((long)(uVar50 * 2) >> 0x2b)
                                    + iVar36;
                      eVar97 = Crop<idx2::extent,idx2::extent>(&Skip_1,&VolExtentInBricks);
                      iStack_3108 = (((int)eVar97.Dims << 0xb) >> 0xb) *
                                    (int)((long)(eVar97.Dims * 2) >> 0x2b) *
                                    (int)((long)(eVar97.Dims << 0x16) >> 0x2b) + iVar37;
                      First_2.Address = local_3700->Address;
                      local_3100 = (long)(int)uVar62 * (long)(int)uVar63 * (long)(int)uVar77 +
                                   First_2.Address;
                      Val = (brick_volume *)
                            (((long)(ExtentInBricks.Dims << 0x16) >> 0xb) +
                            ((long)(ExtentInBricks.From << 0x16) >> 0xb & 0xffffffff00000000U));
                      iVar71 = (int)((long)(ExtentInBricks.From << 0x2b) >> 0x2b);
                      iVar72 = (((int)ExtentInBricks.Dims << 0xb) >> 0xb) + iVar71;
                      iVar60 = (int)((long)(ExtentInBricks.From * 2) >> 0x2b);
                      iVar81 = (int)((long)(ExtentInBricks.Dims * 2) >> 0x2b) + iVar60;
                      iVar85 = (int)((ulong)Val >> 0x20);
                      iVar69 = (int)((long)(ExtentInBricks.From << 0x16) >> 0x2b);
                      if (((aiStack_3128[0] < iVar72) && (aiStack_3128[1] < iVar85)) &&
                         (((aiStack_3128[2] < iVar81 &&
                           ((iVar71 < aiStack_3128[3] && (iVar69 < iStack_3118)))) &&
                          (iVar60 < iStack_3114)))) {
                        auVar19._8_8_ = Skip.Dims;
                        auVar19._0_8_ = Skip.From;
                        auVar19._16_4_ = aiStack_3128[0];
                        auVar19._20_4_ = aiStack_3128[1];
                        auVar19._24_4_ = aiStack_3128[2];
                        auVar19._28_4_ = aiStack_3128[3];
                        auVar20._4_4_ = iStack_3114;
                        auVar20._0_4_ = iStack_3118;
                        auVar20._8_8_ = lStack_3110;
                        auVar20._16_4_ = iStack_3108;
                        auVar20._20_4_ = uStack_3104;
                        auVar20._24_8_ = local_3100;
                        *(undefined1 (*) [32])((long)&(local_3700->ChunkTo3).field_0 + 4) = auVar20;
                        *(undefined1 (*) [32])local_3700 = auVar19;
                        local_3770 = uVar57;
                      }
                      piVar84 = local_3820;
                      uVar57 = local_3770;
                      ppVar90 = local_37d0;
                      if ((int)local_3808 < iVar72) {
                        Val = (brick_volume *)((ulong)Val >> 0x20);
                        if ((((int)(uint)local_37e8 < iVar85) && ((int)local_3800 < iVar81)) &&
                           (iVar71 < (int)local_37f0)) {
                          if (iVar60 < (int)local_3818 && iVar69 < (int)local_37d8) {
                            uVar57 = (ulong)((int)local_3770 + 1);
                            auVar15._8_8_ = First_2.PrevOrder;
                            auVar15._0_8_ = First_2.BrickOrder;
                            auVar15._16_4_ = First_2.BrickFrom3.field_0.field_0.X;
                            auVar15._20_4_ = First_2.BrickFrom3.field_0.field_0.Y;
                            auVar15._24_4_ = First_2.BrickFrom3.field_0.field_0.Z;
                            auVar15._28_4_ = First_2.BrickTo3.field_0.field_0.X;
                            auVar17._4_4_ = First_2.BrickTo3.field_0.field_0.Z;
                            auVar17._0_4_ = First_2.BrickTo3.field_0.field_0.Y;
                            auVar17._8_8_ = First_2.NBricksBefore;
                            auVar17._16_4_ = First_2.BrickInChunk;
                            auVar17._20_4_ = First_2._52_4_;
                            auVar17._24_8_ = First_2.Address;
                            *(undefined1 (*) [32])((long)&(&First_1)[uVar57].ChunkTo3.field_0 + 4) =
                                 auVar17;
                            *(undefined1 (*) [32])(&First_1 + uVar57) = auVar15;
                            local_3770 = uVar57;
                          }
                        }
                      }
                    }
                    else {
                      Ds.BrickInChunk = (&First_1)[uVar49].ChunkInFile;
                      brick_volume::brick_volume((brick_volume *)&Skip_1);
                      Resize((volume *)&Skip_1,&Idx2->BrickDimsExt3,float64,D.Alloc);
                      for (lVar56 = 0;
                          ((long)(local_3420 << 0x16) >> 0x2b) * ((long)(local_3420 * 2) >> 0x2b) *
                          ((long)(local_3420 << 0x2b) >> 0x2b) * 8 != lVar56; lVar56 = lVar56 + 8) {
                        *(undefined8 *)(Skip_1.From + lVar56) = 0;
                      }
                      Ds.Level = (i8)local_3798;
                      Ds.Brick3.field_0.field_0.Z = (local_3700->ChunkFrom3).field_0.field_0.Z;
                      Ds.Brick3.field_0.field_3.XY.field_0 =
                           (v2<int>)(local_3700->ChunkFrom3).field_0.field_3.XY.field_0;
                      Brick3.field_0.field_0.Y = 0;
                      Brick3.field_0.field_0.X = uVar62;
                      Brick3.field_0._8_4_ = SUB84(Val,0);
                      Ds.Brick = GetLinearBrick((idx2 *)piVar84,
                                                (idx2_file *)(ulong)(uint)(int)(char)bVar65,
                                                (int)*(undefined8 *)
                                                      &(local_3700->ChunkFrom3).field_0,Brick3);
                      BrickKey = Ds.Brick * 0x10 + local_3778;
                      Insert<unsigned_long,idx2::brick_volume>
                                (&BrickIt,(idx2 *)&D.BrickPool,
                                 (hash_table<unsigned_long,_idx2::brick_volume> *)&BrickKey,
                                 &Skip_1.From,Val);
                      iVar37 = Ds.BrickInChunk;
                      local_3754 = Ds.Brick3.field_0.field_0.X;
                      local_37bc = Ds.Brick3.field_0.field_0.Y;
                      local_37c0 = Ds.Brick3.field_0.field_0.Z;
                      local_3728 = (brick_volume *)(long)Ds.Level;
                      local_34f8 = Ds.Brick;
                      First_2.BrickOrder = (u64)(&(local_3728->Vol).Buffer.Data + Ds.Brick * 2);
                      Lookup<unsigned_long,idx2::brick_volume>
                                (&BrickIt_1,(idx2 *)&D.BrickPool,
                                 (hash_table<unsigned_long,_idx2::brick_volume> *)&First_2,
                                 (unsigned_long *)local_3728);
                      Val = BrickIt_1.Val;
                      Streams.LogCapacity = 0;
                      Streams.Alloc = (allocator *)0x0;
                      Streams.Keys = (short *)0x0;
                      Streams.Vals = (bitstream *)0x0;
                      Streams.Stats = (bucket_status *)0x0;
                      Streams.Size = 0;
                      __ScopeGuard__251.Dismissed = false;
                      __ScopeGuard__251.Func.Streams = &Streams;
                      Mallocator();
                      Init<short,idx2::bitstream>(&Streams,7,&Mallocator::Instance.super_allocator);
                      cVar40 = (char)local_3728 + '\x01';
                      local_3508 = (long)cVar40;
                      local_3510 = local_3518->Arr + (long)local_3728;
                      local_37c4 = (int)local_3728 + 1;
                      local_3500 = local_3520->Arr + (long)local_3728;
                      uVar57 = 0;
                      pbVar79 = local_3728;
LAB_0015aeb7:
                      iVar60 = local_3754;
                      uVar77 = (uint)(char)uVar57;
                      if ((int)(char)(piVar84->Subbands).Size == uVar77) {
                        InverseCdf53(&Idx2->BrickDimsExt3,(int)pbVar79,local_3528,local_3530,
                                     &Val->Vol,local_37c4 == piVar84->NLevels);
                        *(char **)(lVar9 + -0xe80) =
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp"
                        ;
                        *(undefined4 *)(lVar10 + -0xf80) = 0x140;
                        pcVar58 = "";
                        uVar77 = 0;
                      }
                      else {
                        if ('\x0f' < (char)pbVar79) goto LAB_0015cf24;
                        if (((piVar84->DecodeSubbandMasks).Arr[(long)&(pbVar79->Vol).Buffer] >>
                             (uVar77 & 0x1f) & 1) == 0) goto LAB_0015c42c;
                        local_37b8 = (uint)uVar57;
                        local_34d0 = (long)(int)uVar77;
                        pbVar11 = (piVar84->Subbands).Buffer.Data;
                        pauVar1 = (undefined1 (*) [16])(pbVar11 + local_34d0 * 0x40);
                        lVar56 = *(long *)(pbVar11 + local_34d0 * 0x40 + 8);
                        iVar69 = (int)((lVar56 << 0x16) >> 0x2b);
                        cVar43 = piVar84->NLevels;
                        local_37a4 = uVar77;
                        if (((char)uVar57 == '\0') && (cVar40 < cVar43)) {
                          local_37e8 = CONCAT71(local_37e8._1_7_,1 < iVar69);
                          local_3808 = CONCAT71(local_3808._1_7_,1 < lVar56 * 2 >> 0x2b);
                          Brick3_00.field_0._0_8_ =
                               (unsigned_long *)
                               ((long)local_37c0 / (long)(local_3820->GroupBrick3).field_0.field_0.Z
                               & 0xffffffff);
                          Brick3_00.field_0._8_4_ =
                               (int)((long)local_3754 /
                                    (long)(local_3820->GroupBrick3).field_0.field_0.X);
                          uVar50 = GetLinearBrick((idx2 *)local_3820,
                                                  (idx2_file *)(ulong)(uint)(int)cVar40,
                                                  Brick3_00.field_0._8_4_,Brick3_00);
                          PKey = uVar50 * 0x10 + local_3508;
                          Lookup<unsigned_long,idx2::brick_volume>
                                    ((iterator *)&First_2,(idx2 *)&D.BrickPool,
                                     (hash_table<unsigned_long,_idx2::brick_volume> *)&PKey,
                                     Brick3_00.field_0._0_8_);
                          piVar84 = local_3820;
                          local_3800 = CONCAT71(local_3800._1_7_,1 < (lVar56 << 0x2b) >> 0x2b);
                          uVar77 = (local_3820->GroupBrick3).field_0.field_0.X;
                          uVar62 = (local_3820->GroupBrick3).field_0.field_0.Y;
                          uVar63 = (local_3820->GroupBrick3).field_0.field_0.Z;
                          Skip.From = (ulong)(local_37c0 - local_37c0 % (int)uVar63 & 0x1fffff) <<
                                      0x2a | (ulong)(local_37bc - local_37bc % (int)uVar62 &
                                                    0x1fffff) << 0x15 |
                                             (ulong)(iVar60 - iVar60 % (int)uVar77 & 0x1fffff);
                          Skip.Dims = (ulong)(uVar63 & 0x1fffff) << 0x2a |
                                      ((ulong)uVar62 & 0x1fffff) << 0x15 | (ulong)uVar77 & 0x1fffff;
                          auVar34._8_8_ = 0;
                          auVar34._0_8_ =
                               (ulong)((local_3510->field_0).field_0.Z & 0x1fffff) << 0x2a |
                               ((ulong)(uint)(local_3510->field_0).field_0.Y & 0x1fffff) << 0x15 |
                               (ulong)(uint)(local_3510->field_0).field_0.X & 0x1fffff;
                          SbGridNonExt.super_extent = (extent)(auVar34 << 0x40);
                          eVar97 = Crop<idx2::extent,idx2::extent>(&Skip,&SbGridNonExt.super_extent)
                          ;
                          uVar62 = (int)((lVar56 << 0x2b) >> 0x2b) - (uint)(byte)local_3800;
                          uVar77 = iVar69 - (uint)(byte)local_37e8;
                          uVar63 = (int)(lVar56 * 2 >> 0x2b) - (uint)(byte)local_3808;
                          SbGridNonExt.Strd = *(u64 *)pauVar1[1];
                          PGrid.Dims = (ulong)(uVar63 & 0x1fffff) << 0x2a |
                                       (ulong)(uVar77 & 0x1fffff) << 0x15 |
                                       (ulong)(uVar62 & 0x1fffff);
                          SbGridNonExt.super_extent.From = SUB168(*pauVar1,0);
                          SbGridNonExt.super_extent.Dims = PGrid.Dims;
                          PGrid.From = (ulong)((local_37c0 %
                                               (piVar84->GroupBrick3).field_0.field_0.Z) * uVar63 &
                                              0x1fffff) << 0x2a |
                                       (ulong)((local_37bc %
                                               (piVar84->GroupBrick3).field_0.field_0.Y) * uVar77 &
                                              0x1fffff) << 0x15 |
                                       (ulong)((iVar60 % (piVar84->GroupBrick3).field_0.field_0.X) *
                                               uVar62 & 0x1fffff);
                          CopyExtentGrid<double,double>
                                    (&PGrid,(volume *)First_2.PrevOrder,&SbGridNonExt,&Val->Vol);
                          piVar84 = local_3820;
                          if (((local_3754 ==
                                (((int)eVar97.Dims << 0xb) >> 0xb) +
                                (((int)eVar97.From << 0xb) >> 0xb) + -1) &&
                              ((uVar57 = ((long)(eVar97.Dims << 0x16) >> 0xb) + -0x100000000 +
                                         ((long)(eVar97.From << 0x16) >> 0xb & 0xffffffff00000000U),
                               Brick3_00.field_0._0_8_ = (unsigned_long *)(uVar57 >> 0x20),
                               local_37bc == (int)(uVar57 >> 0x20) &&
                               ((int)((long)(eVar97.Dims * 2) >> 0x2b) +
                                (int)((long)(eVar97.From * 2) >> 0x2b) + -1 == local_37c0)))) &&
                             ((local_37d0->OutMode != HashMap ||
                              (*(char *)(First_2.PrevOrder + 0x3a) == '\0')))) {
                            Dealloc((brick_volume *)First_2.PrevOrder);
                            Delete<unsigned_long,idx2::brick_volume>
                                      ((iterator *)&Skip,(idx2 *)&D.BrickPool,
                                       (hash_table<unsigned_long,_idx2::brick_volume> *)&PKey,
                                       Brick3_00.field_0._0_8_);
                          }
                          cVar43 = piVar84->NLevels;
                          pbVar79 = local_3728;
                        }
                        piVar84 = local_3820;
                        Brick = local_34f8;
                        lVar56 = *(long *)(*pauVar1 + 8);
                        iVar45 = ((int)lVar56 << 0xb) >> 0xb;
                        iVar60 = (local_3820->BlockDims3).field_0.field_0.X;
                        iVar69 = (local_3820->BlockDims3).field_0.field_0.Y;
                        iVar71 = (local_3820->BlockDims3).field_0.field_0.Z;
                        iVar81 = (int)((ulong)(lVar56 << 0x16) >> 0x20);
                        iVar72 = iVar81 >> 0xb;
                        iVar85 = (int)((ulong)(lVar56 * 2) >> 0x20);
                        iVar73 = iVar85 >> 0xb;
                        uVar57 = (long)(iVar60 + -1 + iVar45) / (long)iVar60;
                        local_3808 = uVar57 & 0xffffffff;
                        uVar78 = (long)(iVar69 + -1 + iVar72) / (long)iVar69;
                        local_3800 = uVar78 & 0xffffffff;
                        uVar49 = (long)(iVar73 + iVar71 + -1) / (long)iVar71;
                        local_3718 = uVar49 & 0xffffffff;
                        iVar70 = (int)uVar57 * (int)uVar49 * (int)uVar78;
                        if (((char)local_37b8 == '\0') && (local_37c4 < cVar43)) {
                          iVar70 = iVar70 - (int)((long)((ulong)(uint)(iVar85 >> 0x1f) << 0x20 |
                                                        lVar56 * 2 >> 0x2b & 0xffffffffU) /
                                                 (long)iVar71) * (iVar45 / iVar60) *
                                            (int)((long)((ulong)(uint)(iVar81 >> 0x1f) << 0x20 |
                                                        (ulong)((lVar56 << 0x16) >> 0xb) >> 0x20) /
                                                 (long)iVar69);
                        }
                        ReadChunkExponents((expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code>
                                            *)&SbGridNonExt,local_3820,&D,local_34f8,(i8)pbVar79,
                                           (i8)local_37a4);
                        if (local_3650 == true) {
                          bVar41 = piVar84->DType - int64;
                          local_37b0 = 0;
                          bVar42 = 0;
                          if (bVar41 < 4) {
                            bVar42 = (byte)*(undefined4 *)(&DAT_00187130 + (ulong)bVar41 * 4);
                          }
                          lVar56 = (long)(iVar70 * iVar37 << (bVar42 & 0x1f));
                          local_3738 = *(long *)(SbGridNonExt.super_extent.Dims + 8) + lVar56;
                          local_3730 = *(ulong *)(*(long *)(SbGridNonExt.super_extent.Dims + 8) +
                                                 lVar56);
                          uVar63 = (int)local_3808 - 1;
                          uVar62 = (int)local_3800 - 1;
                          uVar77 = (int)local_3718 - 1;
                          local_37e8 = CONCAT44(local_37e8._4_4_,
                                                (((uVar77 * 0x100 & 0xffff | uVar77 * 0x10000 |
                                                  uVar77 & 0xff) & 0x300f00f) * 0x11 & 0x30c30c3) *
                                                0x14 & 0x24924924 |
                                                (((uVar62 * 0x100 & 0xffff | uVar62 * 0x10000 |
                                                  uVar62 & 0xff) & 0x300f00f) * 0x11 & 0x30c30c3) *
                                                10 & 0x12492492 |
                                                (((uVar63 * 0x100 & 0xffff | uVar63 * 0x10000 |
                                                  uVar63 & 0xff) & 0x300f00f) * 0x11 & 0x30c30c3) *
                                                5 & 0x9249249);
                          Clear<short,idx2::bitstream>(&Streams);
                          local_37ac = 0;
                          uVar77 = 0;
LAB_0015b4cc:
                          do {
                            if ((uint)local_37e8 < uVar77) goto LAB_0015c3ea;
                            uVar63 = (uVar77 & 0x9249249) >> 2 | uVar77 & 0x9249249;
                            uVar62 = uVar63 & 0x30c30c3;
                            uVar62 = (uVar62 >> 4 | uVar62) & 0x300f00f;
                            uVar62 = (uVar63 >> 0x10 & 0x300 | uVar62 >> 8 | uVar62) & 0x3ff;
                            if ((int)uVar62 < (int)local_3808) {
                              uVar68 = uVar77 >> 1 & 0x9249249;
                              uVar75 = uVar68 >> 2;
                              uVar63 = uVar75 + uVar68 & 0x30c30c3;
                              local_37f0 = (uVar63 >> 4 | uVar63) & 0x300f00f;
                              local_37d8 = CONCAT44(local_37d8._4_4_,local_37f0 >> 8);
                              uVar63 = (uVar75 + uVar68 >> 0x10 & 0x300 | local_37f0 >> 8 |
                                       local_37f0) & 0x3ff;
                              if ((int)uVar63 < (int)local_3800) {
                                uVar88 = uVar77 >> 2 & 0x9249248;
                                uVar86 = uVar77 & 0x24924924;
                                uVar76 = uVar88 + uVar86 >> 2 & 0x30c30c3;
                                uVar76 = (uVar76 >> 4 | uVar76) & 0x300f00f;
                                uVar76 = (uVar88 + uVar86 >> 0x12 & 0x300 | uVar76 >> 8 | uVar76) &
                                         0x3ff;
                                if ((int)uVar76 < (int)local_3718) {
                                  iVar60 = (local_3820->BlockDims3).field_0.field_0.X;
                                  local_374c = (local_3820->BlockDims3).field_0.field_0.Y;
                                  local_3750 = (local_3820->BlockDims3).field_0.field_0.Z;
                                  iVar69 = uVar76 * local_3750;
                                  local_37a8 = uVar62 * iVar60;
                                  iVar71 = uVar63 * local_374c;
                                  pbVar11 = (local_3500->Buffer).Data;
                                  lVar56 = local_34d0 * 0xc;
                                  local_3821 = (iVar71 % *(int *)(pbVar11 + lVar56 + 4) != 0 ||
                                               local_37a8 % *(int *)(pbVar11 + lVar56) != 0) ||
                                               iVar69 % *(int *)(pbVar11 + lVar56 + 8) != 0;
                                  iVar81 = iVar45 - local_37a8;
                                  iVar71 = iVar72 - iVar71;
                                  uVar62 = iVar73 - iVar69;
                                  iVar69 = iVar60;
                                  if (iVar81 < iVar60) {
                                    iVar69 = iVar81;
                                  }
                                  iVar85 = local_374c;
                                  if (iVar71 < local_374c) {
                                    iVar85 = iVar71;
                                  }
                                  uVar63 = local_3750;
                                  if ((int)uVar62 < (int)local_3750) {
                                    uVar63 = uVar62;
                                  }
                                  local_3790 = (ulong)uVar63;
                                  local_37b4 = uVar77;
                                  local_34f0 = (ulong)uVar88;
                                  local_34e8 = (ulong)uVar86;
                                  local_34e0 = (ulong)uVar75;
                                  local_34d8 = (ulong)uVar68;
                                  if (((((char)local_37b8 != '\0') ||
                                       (local_3820->NLevels <= local_37c4)) || (iVar81 < iVar60)) ||
                                     ((iVar71 < local_374c || ((int)uVar62 < (int)local_3750)))) {
                                    uVar77 = (uint)(1 < (int)uVar63) +
                                             (uint)(1 < iVar85) + (uint)(1 < iVar69);
                                    local_36f8 = (ulong)uVar77;
                                    uVar77 = 1 << (char)uVar77 * '\x02';
                                    memset(&Skip,0,0x200);
                                    dVar59 = local_3820->DType;
                                    if ((dVar59 < 10) && ((0x2c0U >> (dVar59 & 0x1f) & 1) != 0)) {
                                      if (0x30 < (int)local_37b0) {
                                        local_3730 = *(ulong *)(local_3738 +
                                                               (ulong)(local_37b0 >> 3));
                                        local_3738 = (ulong)(local_37b0 >> 3) + local_3738;
                                        local_37b0 = local_37b0 & 7;
                                      }
                                      uVar87 = (ushort)(local_3730 >> ((byte)local_37b0 & 0x3f)) &
                                               (ushort)bitstream::Masks.Arr[0x10];
                                      local_37b0 = local_37b0 + 0x10;
                                      iVar60 = -0x3ff;
                                    }
                                    else {
                                      if (0x38 < (int)local_37b0) {
                                        local_3730 = *(ulong *)(local_3738 +
                                                               (ulong)(local_37b0 >> 3));
                                        local_3738 = (ulong)(local_37b0 >> 3) + local_3738;
                                        local_37b0 = local_37b0 & 7;
                                      }
                                      uVar87 = (ushort)(local_3730 >> ((byte)local_37b0 & 0x3f)) &
                                               (ushort)bitstream::Masks.Arr[8];
                                      local_37b0 = local_37b0 + 8;
                                      iVar60 = -0x7f;
                                    }
                                    N = '\0';
                                    uVar55 = 0x40;
                                    if (dVar59 < __Invalid__) {
                                      uVar55 = *(undefined4 *)(&DAT_00186d50 + (ulong)dVar59 * 4);
                                    }
                                    local_3720 = CONCAT44(local_3720._4_4_,uVar55);
                                    if ((__x != 0.0) || (NAN(__x))) {
                                      frexp(__x,(int *)&PGrid);
                                      iVar69 = (int)PGrid.From;
                                      if ((int)PGrid.From < -0x3fd) {
                                        iVar69 = -0x3fe;
                                      }
                                      iVar69 = iVar69 + -6;
                                    }
                                    else {
                                      iVar69 = -0x405;
                                    }
                                    local_34c0 = (ulong)(uint)((short)uVar87 + iVar60);
                                    uVar62 = iVar69 - (short)((short)uVar87 + iVar60);
                                    iVar60 = local_3820->BitPlanesPerChunk;
                                    cVar43 = '?';
                                    local_37f8 = local_37f8 & 0xffffffff00000000;
                                    local_3788 = CONCAT44(local_3788._4_4_,uVar62);
                                    local_3768 = (ulong)uVar77;
                                    while( true ) {
                                      Key = (short *)(ulong)uVar62;
                                      if (cVar43 < (int)local_3720) break;
                                      local_36e8 = CONCAT71(local_36e8._1_7_,cVar43);
                                      iVar71 = (int)(short)((short)local_34c0 + (short)cVar43);
                                      iVar69 = iVar71 + 0x400;
                                      BpKey = (i16)(iVar69 / iVar60);
                                      if ((__x != 0.0) || (NAN(__x))) {
                                        frexp(__x,(int *)&PGrid);
                                        Key = (short *)0xfffffc02;
                                        iVar81 = (int)PGrid.From;
                                        if ((int)PGrid.From < -0x3fd) {
                                          iVar81 = -0x3fe;
                                        }
                                      }
                                      else {
                                        iVar81 = -0x3ff;
                                      }
                                      iVar71 = iVar71 - iVar81;
                                      if ((iVar71 < 0x39) && (iVar69 % iVar60 == 0)) {
LAB_0015bcdf:
                                        uVar62 = (uint)local_3788;
                                        break;
                                      }
                                      local_3710 = (ulong)(uint)(int)cVar43;
                                      Lookup<short,idx2::bitstream>
                                                ((iterator *)&PGrid,(idx2 *)&Streams,
                                                 (hash_table<short,_idx2::bitstream> *)&BpKey,Key);
                                      if (local_36c8->Stats[local_36c0] == Occupied) {
                                        local_3810 = *(uint *)(PGrid.Dims + 0x28);
                                      }
                                      else {
                                        ReadChunk((
                                                  expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code>
                                                  *)&PKey,local_3820,&D,Brick,(i8)local_3728,
                                                  (i8)local_37a4,BpKey);
                                        uVar67 = aStack_3680.Val;
                                        if (local_3670 != true) goto LAB_0015bcdf;
                                        Brick3_00.field_0._0_8_ =
                                             (unsigned_long *)
                                             ((aStack_3680.Val)->Bricks).Buffer.Data;
                                        Brick3_00.field_0._0_8_ =
                                             BinarySearch<unsigned_long,unsigned_long*>
                                                       (Brick3_00.field_0._0_8_,
                                                        Brick3_00.field_0._0_8_ +
                                                        ((aStack_3680.Val)->Bricks).Size,&Brick);
                                        lVar56 = (long)*(int *)((((chunk_cache *)uVar67)->
                                                                BrickOffsets).Buffer.Data +
                                                               ((long)Brick3_00.field_0._0_8_ -
                                                                (long)(((chunk_cache *)uVar67)->
                                                                      Bricks).Buffer.Data >> 1));
                                        Insert<short,idx2::bitstream>
                                                  ((iterator *)&PGrid,&BpKey,
                                                   &((chunk_cache *)uVar67)->ChunkStream);
                                        *(long *)(PGrid.Dims + 0x18) = *(long *)PGrid.Dims + lVar56;
                                        *(undefined8 *)(PGrid.Dims + 0x20) =
                                             *(undefined8 *)(*(long *)PGrid.Dims + lVar56);
                                        *(undefined4 *)(PGrid.Dims + 0x28) = 0;
                                        local_3810 = 0;
                                      }
                                      uVar50 = PGrid.Dims;
                                      local_3760 = CONCAT71(local_3760._1_7_,0x38 < iVar71);
                                      local_36f0 = *(ulong *)PGrid.Dims;
                                      local_3818 = *(long *)(PGrid.Dims + 0x18);
                                      if ((int)(uint)local_3788 < 8) {
                                        Decode<unsigned_long>
                                                  (&Skip.From,(int)local_3768,(int)local_3710,&N,
                                                   (bitstream *)PGrid.Dims,local_3821);
                                        lVar56 = *(long *)(uVar50 + 0x18);
                                        uVar63 = *(uint *)(uVar50 + 0x28);
                                      }
                                      else {
                                        aStack_3680._8_8_ = *(undefined8 *)(PGrid.Dims + 0x10);
                                        PKey = *(u64 *)PGrid.Dims;
                                        aStack_3680.Val = (chunk_cache *)*(long *)(PGrid.Dims + 8);
                                        auVar6 = *(undefined1 (*) [16])PGrid.Dims;
                                        uVar57 = *(ulong *)(PGrid.Dims + 0x20);
                                        uVar62 = (uint)N;
                                        lVar56 = local_3818;
                                        if ((int)uVar62 < 1) {
                                          uVar80 = 0;
                                          uVar63 = local_3810;
                                        }
                                        else {
                                          uVar68 = 0x40 - local_3810;
                                          uVar63 = uVar62;
                                          if ((int)uVar68 < (int)uVar62) {
                                            uVar63 = uVar68;
                                          }
                                          if (0x40 < (int)uVar63) {
LAB_0015cf0d:
                                            pcVar58 = 
                                            "t &idx2::stack_array<unsigned long, 65>::operator[](int) const [t = unsigned long, N = 65]"
                                            ;
                                            goto LAB_0015cf39;
                                          }
                                          uVar80 = uVar57 >> ((byte)local_3810 & 0x3f) &
                                                   bitstream::Masks.Arr[(int)uVar63];
                                          uVar63 = uVar63 + local_3810;
                                          iVar69 = uVar62 - uVar68;
                                          if (iVar69 != 0 && (int)uVar68 <= (int)uVar62) {
                                            if (0x40 < iVar69) goto LAB_0015cf0d;
                                            local_34c8 = (long)((int)uVar63 >> 3);
                                            uVar57 = *(ulong *)(local_3818 + local_34c8);
                                            uVar80 = uVar80 | (uVar57 >> (sbyte)(uVar63 & 7) &
                                                              bitstream::Masks.Arr[iVar69]) <<
                                                              ((byte)uVar68 & 0x3f);
                                            lVar56 = local_3818 + local_34c8;
                                            uVar63 = (uVar63 & 7) + iVar69;
                                          }
                                        }
                                        while ((int)(char)uVar62 < (int)local_3768) {
                                          if (0x3f < (int)uVar63) {
                                            uVar57 = *(ulong *)(lVar56 + (ulong)(uVar63 >> 3));
                                            lVar56 = lVar56 + (ulong)(uVar63 >> 3);
                                            uVar63 = uVar63 & 7;
                                          }
                                          bVar42 = (byte)uVar63;
                                          uVar63 = uVar63 + 1;
                                          if ((uVar57 >> (bVar42 & 0x3f) & bitstream::Masks.Arr[1])
                                              == 0) break;
                                          while (bVar42 = (byte)uVar62,
                                                (int)(char)bVar42 < (int)(uVar77 - 1)) {
                                            if (0x3f < (int)uVar63) {
                                              uVar57 = *(ulong *)(lVar56 + (ulong)(uVar63 >> 3));
                                              lVar56 = lVar56 + (ulong)(uVar63 >> 3);
                                              uVar63 = uVar63 & 7;
                                            }
                                            bVar41 = (byte)uVar63;
                                            uVar63 = uVar63 + 1;
                                            if ((uVar57 >> (bVar41 & 0x3f) & bitstream::Masks.Arr[1]
                                                ) != 0) break;
                                            uVar62 = (uint)(byte)(bVar42 + 1);
                                          }
                                          uVar62 = uVar62 + 1;
                                          N = (i8)uVar62;
                                          uVar80 = uVar80 + (1L << (bVar42 & 0x3f));
                                        }
                                        (&Skip.From)[0x3f - (int)local_3710] = uVar80;
                                        *(undefined8 *)(PGrid.Dims + 0x10) = aStack_3680._8_8_;
                                        *(undefined1 (*) [16])PGrid.Dims = auVar6;
                                        *(long *)(PGrid.Dims + 0x18) = lVar56;
                                        *(ulong *)(PGrid.Dims + 0x20) = uVar57;
                                        *(uint *)(PGrid.Dims + 0x28) = uVar63;
                                      }
                                      local_37f8 = CONCAT44(local_37f8._4_4_,
                                                            CONCAT31((int3)(local_37f8 >> 8),
                                                                     (char)local_37f8 +
                                                                     (char)local_3760));
                                      LOCK();
                                      D.BytesDecoded_.super___atomic_base<unsigned_long>._M_i =
                                           (__atomic_base<unsigned_long>)
                                           ((long)D.BytesDecoded_.super___atomic_base<unsigned_long>
                                                  ._M_i +
                                           ((long)(int)uVar63 - (long)(int)local_3810) +
                                           ((local_36f0 + lVar56) - (local_3818 + *(long *)uVar50))
                                           * 8);
                                      UNLOCK();
                                      cVar43 = (char)local_36e8 + -1;
                                      uVar62 = (uint)local_3788;
                                    }
                                    local_3821 = (bool)(local_3821 | (char)local_37f8 < '\x01');
                                    if (local_3821 == false) {
                                      if (7 < (int)uVar62) {
                                        TransposeRecursive<unsigned_long>
                                                  (&Skip.From,(int)(char)local_37f8);
                                      }
                                      LOCK();
                                      D.NSignificantBlocks.super___atomic_base<long>._M_i =
                                           (__atomic_base<long>)
                                           ((long)D.NSignificantBlocks.super___atomic_base<long>.
                                                  _M_i + 1);
                                      UNLOCK();
                                      eVar98 = (error<idx2::idx2_err_code>)
                                               (*(code *)(&DAT_00186d00 +
                                                         *(int *)(&DAT_00186d00 +
                                                                 (local_36f8 & 0xffffffff) * 4)))();
                                      return eVar98;
                                    }
                                  }
                                  uVar77 = local_37b4 + 1;
                                  goto LAB_0015b4cc;
                                }
                              }
                            }
                            iVar60 = 0;
                            if (uVar77 != 0) {
                              for (; (uVar77 >> iVar60 & 1) == 0; iVar60 = iVar60 + 1) {
                              }
                            }
                            bVar42 = (char)iVar60 + 1;
                            if (uVar77 == 0) {
                              bVar42 = 0;
                            }
                            uVar77 = (uVar77 >> (bVar42 & 0x1f)) + 1 << (bVar42 & 0x1f);
                          } while( true );
                        }
                        uVar77 = (uint)SbGridNonExt.Strd;
                        pcVar58 = (char *)SbGridNonExt.super_extent.Dims;
                        Val = pbVar79;
                      }
                      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp:251:3)>
                      ::~scope_guard(&__ScopeGuard__251);
                      ppVar90 = local_37d0;
                      if ((char)uVar77 != '\0') {
                        cVar39 = (char)(uVar77 >> 8);
                        if ('?' < cVar39) {
                          __assert_fail("false && \"stack too deep\"",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp"
                                        ,0x1aa,
                                        "auto idx2::Decode(const idx2_file &, const params &, buffer *)::(anonymous class)::operator()() const"
                                       );
                        }
                        *(undefined4 *)(lVar10 + -0xf7c + (long)cVar39 * 4) = 0x1aa;
                        *(char **)(lVar9 + -0xe78 + (long)cVar39 * 8) =
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp"
                        ;
                        uVar57 = (ulong)(uVar77 & 0xff0000);
                        uVar83 = (ulong)(byte)(cVar39 + 1) << 8;
                        uVar78 = (ulong)(uVar77 & 0xff);
                        goto LAB_0015ccfe;
                      }
                      if (((char)local_3798 == '\0') ||
                         (uVar57 = local_3770,
                         (piVar84->DecodeSubbandMasks).Arr[local_3538 + -1] == '\0')) {
                        Skip.From = (ulong)((local_3700->ChunkFrom3).field_0.field_0.Z * local_37dc
                                           & 0x1fffff) << 0x2a |
                                    (ulong)((local_3700->ChunkFrom3).field_0.field_0.Y * iVar53 &
                                           0x1fffff) << 0x15 |
                                    (ulong)((local_3700->ChunkFrom3).field_0.field_0.X * local_3758
                                           & 0x1fffff);
                        Grid2 = (grid *)(((ulong)(uint)(piVar84->BrickDims3).field_0.field_0.Y &
                                         0x1fffff) << 0x15 |
                                        (ulong)(uint)(piVar84->BrickDims3).field_0.field_0.X &
                                        0x1fffff);
                        Skip.Dims = (ulong)((piVar84->BrickDims3).field_0.field_0.Z & 0x1fffff) <<
                                    0x2a | (ulong)Grid2;
                        aiStack_3128[0] = (int)local_3588.MMap.Buf.Alloc;
                        aiStack_3128[1] = (int)((ulong)local_3588.MMap.Buf.Alloc >> 0x20);
                        Crop<idx2::grid,idx2::grid>
                                  ((grid *)&Streams,(idx2 *)&OutGrid,(grid *)&Skip,Grid2);
                        Relative<idx2::grid,idx2::grid>
                                  (&SbGridNonExt,(idx2 *)&Streams,(grid *)&Skip,Grid2);
                        dVar38 = OutVol.Vol.Type;
                        dVar59 = local_3588.Vol.Type;
                        oVar7 = ppVar90->OutMode;
                        if (oVar7 < HashMap) {
                          Relative<idx2::grid,idx2::grid>
                                    ((grid *)&First_2,(idx2 *)&Streams,&OutGrid,Grid2);
                          if (oVar7 == RegularGridFile) {
                            dVar59 = dVar38;
                          }
                          Key_00 = &local_3588;
                          if (oVar7 == RegularGridFile) {
                            Key_00 = &OutVol;
                          }
                          pcVar51 = CopyGridGrid<double,double>;
                          if (dVar59 == float32) {
                            pcVar51 = CopyGridGrid<double,float>;
                          }
                          (*pcVar51)(&SbGridNonExt,&Skip_1,&First_2);
                          Dealloc((brick_volume *)&Skip_1);
                          Delete<unsigned_long,idx2::brick_volume>
                                    ((iterator *)&First_2,(idx2 *)&D.BrickPool,
                                     (hash_table<unsigned_long,_idx2::brick_volume> *)&BrickKey,
                                     (unsigned_long *)Key_00);
                          uVar57 = local_3770;
                        }
                        else {
                          uVar57 = local_3770;
                          if ((oVar7 == HashMap) && ((BrickIt.Val)->Significant == false)) {
                            Dealloc((brick_volume *)&Skip_1);
                            Delete<unsigned_long,idx2::brick_volume>
                                      ((iterator *)&First_2,(idx2 *)&D.BrickPool,
                                       (hash_table<unsigned_long,_idx2::brick_volume> *)&BrickKey,
                                       (unsigned_long *)Grid2);
                            uVar57 = local_3770;
                          }
                        }
                      }
                    }
                  }
                }
                uVar57 = local_3740 & 0xffffffff;
              }
              else {
                uVar67 = *(undefined8 *)((long)&First + lVar56 + 0x10);
                uVar13 = *(undefined8 *)((long)&First + lVar56 + 0x18);
                uVar14 = *(undefined8 *)((long)&First + lVar56 + 0x20);
                First_1.ChunkTo3.field_0.field_0.Y = (int)uVar14;
                First_1.ChunkTo3.field_0.field_0.Z = (int)((ulong)uVar14 >> 0x20);
                First_1.NChunksBefore = *(i64 *)((long)&First + lVar56 + 0x28);
                First_1.ChunkInFile = (i32)(&uStack_1c08)[uVar57 * 8];
                First_1._52_4_ = SUB84((&uStack_1c08)[uVar57 * 8] >> 0x20,0);
                First_1.Address = (&uStack_1c00)[uVar57 * 8];
                First_1.ChunkOrder = *(u64 *)*pauVar89;
                First_1.PrevOrder = *(u64 *)((long)&First + lVar56 + 8);
                First_1.ChunkFrom3.field_0.field_0.X = (int)uVar67;
                First_1.ChunkFrom3.field_0.field_0.Y = (int)((ulong)uVar67 >> 0x20);
                First_1.ChunkFrom3.field_0.field_0.Z = (int)uVar13;
                First_1.ChunkTo3.field_0.field_0.X = (int)((ulong)uVar13 >> 0x20);
                auVar2 = *pauVar89;
                auVar3 = *(undefined1 (*) [32])((long)&First + lVar56 + 0x18);
                First_2.BrickTo3.field_0.field_0.Y = auVar3._8_4_;
                First_2.BrickTo3.field_0.field_0.Z = auVar3._12_4_;
                First_2.NBricksBefore = auVar3._16_8_;
                First_2.BrickInChunk = auVar3._24_4_;
                First_2._52_4_ = auVar3._28_4_;
                First_2.BrickOrder = auVar2._0_8_;
                First_2.PrevOrder = auVar2._8_8_;
                First_2.BrickFrom3.field_0.field_0.X = auVar2._16_4_;
                First_2.BrickFrom3.field_0.field_0.Y = auVar2._20_4_;
                First_2.BrickFrom3.field_0.field_0.Z = auVar2._24_4_;
                First_2.BrickTo3.field_0.field_0.X = auVar2._28_4_;
                uVar78 = (ulong)(uVar77 << 2);
                iVar60 = *(int *)((long)&First + uVar78 + lVar56 + 0x10);
                iVar60 = (*(int *)((long)&First + uVar78 + lVar56 + 0x1c) - iVar60) / 2 + iVar60;
                *(int *)((long)&First_1.ChunkTo3.field_0 + uVar78) = iVar60;
                *(int *)((long)&First_2.BrickFrom3.field_0 + uVar78) = iVar60;
                iVar36 = First_1.NChunksBefore;
                local_3808 = (ulong)(uint)First_1.ChunkFrom3.field_0.field_0.X;
                local_37e8 = (ulong)(uint)First_1.ChunkFrom3.field_0.field_0.Y;
                local_37f0 = First_1.ChunkTo3.field_0.field_0.X;
                uVar77 = First_1.ChunkTo3.field_0.field_0.X - First_1.ChunkFrom3.field_0._0_4_;
                local_37d8 = CONCAT44(local_37d8._4_4_,First_1.ChunkTo3.field_0.field_0.Y);
                uVar63 = First_1.ChunkTo3.field_0.field_0.Y - First_1.ChunkFrom3.field_0._4_4_;
                local_3818 = CONCAT44(local_3818._4_4_,First_1.ChunkTo3.field_0.field_0.Z);
                uVar62 = First_1.ChunkTo3.field_0.field_0.Z - First_1.ChunkFrom3.field_0._8_4_;
                local_3800 = CONCAT44(local_3800._4_4_,First_1.ChunkFrom3.field_0.field_0.Z);
                Skip.From = (ulong)(First_1.ChunkFrom3.field_0.field_0.Z & 0x1fffff) << 0x2a |
                            (local_37e8 & 0x1fffff) << 0x15 | local_3808 & 0x1fffff;
                Skip.Dims = (ulong)(uVar62 & 0x1fffff) << 0x2a |
                            (ulong)(uVar63 & 0x1fffff) << 0x15 | (ulong)(uVar77 & 0x1fffff);
                local_37f8 = uVar57;
                eVar97 = Crop<idx2::extent,idx2::extent>(&Skip,&ExtentInChunks);
                iVar37 = First_1.ChunkInFile;
                uVar50 = eVar97.Dims;
                First_2.NBricksBefore =
                     ((long)(uVar50 << 0x16) >> 0x2b) * ((long)(uVar50 << 0x2b) >> 0x2b) *
                     ((long)(uVar50 * 2) >> 0x2b) + iVar36;
                eVar97 = Crop<idx2::extent,idx2::extent>(&Skip,&VolExtentInChunks);
                First_2.BrickInChunk =
                     (((int)eVar97.Dims << 0xb) >> 0xb) * (int)((long)(eVar97.Dims * 2) >> 0x2b) *
                     (int)((long)(eVar97.Dims << 0x16) >> 0x2b) + iVar37;
                First_1.Address = (&uStack_1c00)[uVar57 * 8];
                First_2.Address =
                     (long)(int)uVar62 * (long)(int)uVar63 * (long)(int)uVar77 + First_1.Address;
                iVar71 = (int)((long)(ExtentInChunks.From << 0x2b) >> 0x2b);
                iVar72 = (((int)ExtentInChunks.Dims << 0xb) >> 0xb) + iVar71;
                iVar60 = (int)((long)(ExtentInChunks.From * 2) >> 0x2b);
                iVar81 = (int)((long)(ExtentInChunks.Dims * 2) >> 0x2b) + iVar60;
                iVar85 = (int)(((long)(ExtentInChunks.Dims << 0x16) >> 0xb) +
                               ((long)(ExtentInChunks.From << 0x16) >> 0xb & 0xffffffff00000000U) >>
                              0x20);
                iVar69 = (int)((long)(ExtentInChunks.From << 0x16) >> 0x2b);
                if ((((First_2.BrickFrom3.field_0.field_0.X < iVar72) &&
                     (First_2.BrickFrom3.field_0.field_0.Y < iVar85)) &&
                    (First_2.BrickFrom3.field_0.field_0.Z < iVar81)) &&
                   (((iVar71 < First_2.BrickTo3.field_0.field_0.X &&
                     (iVar69 < First_2.BrickTo3.field_0.field_0.Y)) &&
                    (iVar60 < First_2.BrickTo3.field_0.field_0.Z)))) {
                  auVar16._8_8_ = First_2.PrevOrder;
                  auVar16._0_8_ = First_2.BrickOrder;
                  auVar16._16_4_ = First_2.BrickFrom3.field_0.field_0.X;
                  auVar16._20_4_ = First_2.BrickFrom3.field_0.field_0.Y;
                  auVar16._24_4_ = First_2.BrickFrom3.field_0.field_0.Z;
                  auVar16._28_4_ = First_2.BrickTo3.field_0.field_0.X;
                  auVar18._4_4_ = First_2.BrickTo3.field_0.field_0.Z;
                  auVar18._0_4_ = First_2.BrickTo3.field_0.field_0.Y;
                  auVar18._8_8_ = First_2.NBricksBefore;
                  auVar18._16_4_ = First_2.BrickInChunk;
                  auVar18._20_4_ = First_2._52_4_;
                  auVar18._24_8_ = First_2.Address;
                  *(undefined1 (*) [32])((long)&First + lVar56 + 0x20) = auVar18;
                  *pauVar89 = auVar16;
                  local_3740 = local_37f8;
                }
                uVar57 = local_3740;
                if ((((int)local_3808 < iVar72) && ((int)(uint)local_37e8 < iVar85)) &&
                   (((int)local_3800 < iVar81 && (iVar71 < (int)local_37f0)))) {
                  if (iVar60 < (int)local_3818 && iVar69 < (int)local_37d8) {
                    uVar57 = (ulong)((int)local_3740 + 1);
                    lVar56 = uVar57 * 0x40;
                    auVar21._8_8_ = First_1.PrevOrder;
                    auVar21._0_8_ = First_1.ChunkOrder;
                    auVar21._16_4_ = First_1.ChunkFrom3.field_0.field_0.X;
                    auVar21._20_4_ = First_1.ChunkFrom3.field_0.field_0.Y;
                    auVar21._24_4_ = First_1.ChunkFrom3.field_0.field_0.Z;
                    auVar21._28_4_ = First_1.ChunkTo3.field_0.field_0.X;
                    auVar28._4_4_ = First_1.ChunkTo3.field_0.field_0.Z;
                    auVar28._0_4_ = First_1.ChunkTo3.field_0.field_0.Y;
                    auVar28._8_8_ = First_1.NChunksBefore;
                    auVar28._16_4_ = First_1.ChunkInFile;
                    auVar28._20_4_ = First_1._52_4_;
                    auVar28._24_8_ = First_1.Address;
                    *(undefined1 (*) [32])((long)&First + lVar56 + 0x20) = auVar28;
                    *(undefined1 (*) [32])((long)&First + lVar56) = auVar21;
                  }
                }
                uVar57 = uVar57 & 0xffffffff;
                piVar84 = local_3820;
                ppVar90 = local_37d0;
              }
            }
          }
        }
        else {
          uVar13 = *(undefined8 *)&FileStack[uVar49].FileFrom3.field_0;
          uVar67 = *(undefined8 *)((long)&FileStack[uVar49].FileFrom3.field_0 + 8);
          auVar4 = *(undefined1 (*) [12])&FileStack[uVar49].FileTo3;
          uVar5 = FileStack[uVar49].Address;
          First.FileTo3.field_0.field_0.Y = auVar4._4_4_;
          First.FileTo3.field_0.field_0.Z = auVar4._8_4_;
          First.Address = uVar5;
          First.FileOrder = pfVar74->FileOrder;
          First.PrevOrder = FileStack[uVar49].PrevOrder;
          First.FileFrom3.field_0.field_0.X = (int)uVar13;
          First.FileFrom3.field_0.field_0.Y = (int)((ulong)uVar13 >> 0x20);
          First.FileFrom3.field_0.field_0.Z = (int)uVar67;
          First.FileTo3.field_0.field_0.X = (int)((ulong)uVar67 >> 0x20);
          uVar67 = *(undefined8 *)((long)&FileStack[uVar49].FileTo3.field_0 + 4);
          First_1.ChunkTo3.field_0.field_0.Y = (int)uVar67;
          First_1.ChunkTo3.field_0.field_0.Z = (int)((ulong)uVar67 >> 0x20);
          auVar2 = *(undefined1 (*) [32])pfVar74;
          First_1.ChunkOrder = auVar2._0_8_;
          First_1.PrevOrder = auVar2._8_8_;
          First_1.ChunkFrom3.field_0.field_0.X = auVar2._16_4_;
          First_1.ChunkFrom3.field_0.field_0.Y = auVar2._20_4_;
          First_1.ChunkFrom3.field_0.field_0.Z = auVar2._24_4_;
          First_1.ChunkTo3.field_0.field_0.X = auVar2._28_4_;
          uVar57 = (ulong)(uVar77 << 2);
          iVar60 = *(int *)((long)&FileStack[uVar49].FileFrom3.field_0 + uVar57);
          iVar60 = (*(int *)((long)&FileStack[uVar49].FileTo3.field_0 + uVar57) - iVar60) / 2 +
                   iVar60;
          *(int *)((long)&First.FileTo3.field_0 + uVar57) = iVar60;
          *(int *)((long)&First_1.ChunkFrom3.field_0 + uVar57) = iVar60;
          First.Address = FileStack[uVar49].Address;
          First_1.NChunksBefore =
               (long)(First.FileTo3.field_0.field_0.Z - First.FileFrom3.field_0._8_4_) *
               (long)(First.FileTo3.field_0.field_0.Y - First.FileFrom3.field_0._4_4_) *
               (long)(First.FileTo3.field_0.field_0.X - First.FileFrom3.field_0._0_4_) +
               First.Address;
          iVar69 = (int)((ulong)(((long)((ulong)(((int)((long)uVar83 / (long)iVar66) - uVar61) + 1 &
                                                0x1fffff) << 0x2b) >> 0xb) + (lVar82 >> 0xb)) >>
                        0x20);
          iVar60 = (int)(lVar82 >> 0x2b);
          if ((((First_1.ChunkFrom3.field_0.field_0.X < iVar54) &&
               (First_1.ChunkFrom3.field_0.field_0.Y < iVar69)) &&
              ((First_1.ChunkFrom3.field_0.field_0.Z < (int)local_37a0 &&
               ((iVar44 < First_1.ChunkTo3.field_0.field_0.X &&
                (iVar60 < First_1.ChunkTo3.field_0.field_0.Y)))))) &&
             ((int)local_3748 < First_1.ChunkTo3.field_0.field_0.Z)) {
            auVar3._16_4_ = First_1.ChunkFrom3.field_0.field_0.X;
            auVar3._0_16_ = auVar2._0_16_;
            auVar3._20_4_ = First_1.ChunkFrom3.field_0.field_0.Y;
            auVar3._24_4_ = First_1.ChunkFrom3.field_0.field_0.Z;
            auVar3._28_4_ = First_1.ChunkTo3.field_0.field_0.X;
            uVar23 = First_1.ChunkFrom3.field_0.field_0.Y;
            uVar22 = First_1.ChunkFrom3.field_0.field_0.X;
            auVar99._4_4_ = uVar23;
            auVar99._0_4_ = uVar22;
            uVar24 = First_1.ChunkFrom3.field_0.field_0.Z;
            auVar99._8_4_ = uVar24;
            uVar25 = First_1.ChunkTo3.field_0.field_0.X;
            auVar100._12_4_ = uVar25;
            auVar100._0_12_ = auVar99;
            uVar26 = First_1.ChunkTo3.field_0.field_0.Y;
            auVar100._16_4_ = uVar26;
            uVar27 = First_1.ChunkTo3.field_0.field_0.Z;
            auVar100._20_4_ = uVar27;
            pfVar35 = FileStack + uVar49;
            pfVar35->FileFrom3 = (v3i)auVar99;
            pfVar35->FileTo3 = (v3i)auVar100._12_12_;
            pfVar35->Address = First_1.NChunksBefore;
            *(undefined1 (*) [32])pfVar74 = auVar3;
            local_3780 = uVar78;
          }
          uVar78 = local_3780;
          uVar67 = local_3798;
          if (((((First.FileFrom3.field_0.field_0.X < iVar54) &&
                (First.FileFrom3.field_0.field_0.Y < iVar69)) &&
               (First.FileFrom3.field_0.field_0.Z < (int)local_37a0)) &&
              ((iVar44 < First.FileTo3.field_0.field_0.X &&
               (iVar60 < First.FileTo3.field_0.field_0.Y)))) &&
             ((int)local_3748 < First.FileTo3.field_0.field_0.Z)) {
            local_3780 = (ulong)((int)local_3780 + 1);
            auVar2._8_8_ = First.PrevOrder;
            auVar2._0_8_ = First.FileOrder;
            auVar2._16_4_ = First.FileFrom3.field_0.field_0.X;
            auVar2._20_4_ = First.FileFrom3.field_0.field_0.Y;
            auVar2._24_4_ = First.FileFrom3.field_0.field_0.Z;
            auVar2._28_4_ = First.FileTo3.field_0.field_0.X;
            uVar30 = First.FileFrom3.field_0.field_0.Z;
            uVar29 = uVar13;
            auVar101._8_4_ = uVar30;
            auVar101._0_8_ = uVar29;
            uVar31 = First.FileTo3.field_0.field_0.X;
            auVar102._12_4_ = uVar31;
            auVar102._0_12_ = auVar101;
            uVar32 = First.FileTo3.field_0.field_0.Y;
            auVar102._16_4_ = uVar32;
            uVar33 = First.FileTo3.field_0.field_0.Z;
            auVar102._20_4_ = uVar33;
            pfVar74 = FileStack + local_3780;
            pfVar74->FileFrom3 = (v3i)auVar101;
            pfVar74->FileTo3 = (v3i)auVar102._12_12_;
            pfVar74->Address = First.Address;
            *(undefined1 (*) [32])(FileStack + local_3780) = auVar2;
            uVar78 = local_3780;
          }
        }
      }
    }
    iVar52 = iVar52 + -1;
    uVar57 = local_3708;
    lVar56 = local_3588.MMap._0_8_;
    uVar83 = local_3588.MMap._8_8_;
  }
  Bp = &D.BrickPool;
  if (ppVar90->OutMode == HashMap) {
    PrintStatistics(Bp);
    ComputeBrickResolution(Bp);
    WriteBricks(Bp,"bricks");
  }
  clock_gettime(1,(timespec *)&First);
  printf("total decode time   = %f\n",
         (double)(long)((double)(long)(First.FileOrder - DecodeTimer.Start.tv_sec) * 1000000000.0 +
                       (double)(long)(First.PrevOrder - DecodeTimer.Start.tv_nsec)) / 1000000000.0);
  printf("io time             = %f\n",
         (double)(long)D.DecodeIOTime_.super___atomic_base<unsigned_long>._M_i / 1000000000.0);
  printf("data movement time  = %f\n",
         (double)(long)D.DataMovementTime_.super___atomic_base<unsigned_long>._M_i / 1000000000.0);
  uVar78 = 0;
  printf("exp   bytes read    = %li\n",D.BytesExps_.super___atomic_base<unsigned_long>._M_i);
  printf("data  bytes read    = %li\n",D.BytesData_.super___atomic_base<unsigned_long>._M_i);
  printf("total bytes read    = %li\n",
         (long)D.BytesData_.super___atomic_base<unsigned_long>._M_i +
         (long)D.BytesExps_.super___atomic_base<unsigned_long>._M_i);
  printf("total bytes decoded = %li\n",
         (ulong)D.BytesDecoded_.super___atomic_base<unsigned_long>._M_i >> 3);
  printf("final size of brick hashmap = %li\n",D.BrickPool.BrickTable.Size);
  printf("number of significant blocks = %li\n",D.NSignificantBlocks.super___atomic_base<long>._M_i)
  ;
  printf("number of insignificant subbands = %li\n",
         D.NInsignificantSubbands.super___atomic_base<long>._M_i);
  *(char **)(*in_FS_OFFSET + -0x780) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x1eb;
  pcVar58 = "";
  uVar83 = 0;
  uVar57 = 0;
LAB_0015ccfe:
  uVar78 = uVar83 | uVar57 | uVar78;
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp:362:3)>
  ::~scope_guard(&__ScopeGuard__362);
  decode_data::~decode_data(&D);
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp:334:3)>
  ::~scope_guard(&local_3498);
  eVar98.Code = (char)uVar78;
  eVar98.StackIdx = (char)(uVar78 >> 8);
  eVar98.StrGened = (bool)(char)(uVar78 >> 0x10);
  eVar98._11_5_ = (int5)(uVar78 >> 0x18);
  eVar98.Msg = pcVar58;
  return eVar98;
LAB_0015c3ea:
  bVar42 = (byte)local_37ac;
  LOCK();
  D.NInsignificantSubbands.super___atomic_base<long>._M_i =
       (__atomic_base<long>)
       ((long)D.NInsignificantSubbands.super___atomic_base<long>._M_i + (ulong)(bVar42 ^ 1));
  UNLOCK();
  if ((BrickIt_1.Val)->Significant != false) {
    bVar42 = true;
  }
  (BrickIt_1.Val)->Significant = (bool)bVar42;
  uVar57 = (ulong)local_37b8;
  pbVar79 = local_3728;
  piVar84 = local_3820;
LAB_0015c42c:
  uVar57 = CONCAT71((int7)(uVar57 >> 8),(char)uVar57 + '\x01');
  goto LAB_0015aeb7;
}

Assistant:

error<idx2_err_code>
Decode(const idx2_file& Idx2, const params& P, buffer* OutBuf)
{
  timer DecodeTimer;
  StartTimer(&DecodeTimer);
  // TODO: we should add a --effective-mask
  grid OutGrid = GetGrid(Idx2, P.DecodeExtent);
  mmap_volume OutVol;
  volume OutVolMem;
  idx2_CleanUp(if (P.OutMode == params::out_mode::RegularGridFile) { Unmap(&OutVol); });

  if (P.OutMode == params::out_mode::RegularGridFile)
  {
    metadata Met;
    memcpy(Met.Name, Idx2.Name, sizeof(Met.Name));
    memcpy(Met.Field, Idx2.Field, sizeof(Met.Field));
    Met.Dims3 = Dims(OutGrid);
    Met.DType = Idx2.DType;
    //  printf("zfp decode time = %f\n", DecodeTime_);
    cstr OutFile = P.OutFile ? idx2_PrintScratch("%s/%s", P.OutDir, P.OutFile)
                             : idx2_PrintScratch("%s/%s-tolerance-%f.raw", P.OutDir, ToRawFileName(Met), P.DecodeTolerance);
    //    idx2_RAII(mmap_volume, OutVol, (void)OutVol, Unmap(&OutVol));
    MapVolume(OutFile, Met.Dims3, Met.DType, &OutVol, map_mode::Write);
    printf("writing output volume to %s\n", OutFile);
  }
  else if (P.OutMode == params::out_mode::RegularGridMem)
  {
    OutVolMem.Buffer = *OutBuf;
    SetDims(&OutVolMem, Dims(OutGrid));
    OutVolMem.Type = Idx2.DType;
  }

  const int BrickBytes = Prod(Idx2.BrickDimsExt3) * sizeof(f64);
  // TODO: make the free list allocator threadsafe
  //BrickAlloc_ = free_list_allocator(BrickBytes);
  // TODO: move the decode_data into idx2_file itself
  //idx2_RAII(decode_data, D, Init(&D, &BrickAlloc_));
  idx2_RAII(decode_data, D, Init(&D, &Idx2, &Mallocator())); // for now the allocator seems not a bottleneck
  //  D.QualityLevel = Dw->GetQuality();
  f64 Tolerance = Max(Idx2.Tolerance, P.DecodeTolerance);
  //  i64 CountZeroes = 0;

  decode_state Ds;
  idx2_InclusiveForBackward (i8, Level, Idx2.NLevels - 1, 0)
  {
    if (Idx2.DecodeSubbandMasks[Level] == 0)
      break;

    extent Ext = P.DecodeExtent;                  // this is in unit of samples
    v3i B3, Bf3, Bl3, C3, Cf3, Cl3, F3, Ff3, Fl3; // Brick dimensions, brick first, brick last
    B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Level);
    C3 = Idx2.BricksPerChunk3s[Level] * B3;
    F3 = C3 * Idx2.ChunksPerFile3s[Level];

    Bf3 = From(Ext) / B3;
    Bl3 = Last(Ext) / B3;
    Cf3 = From(Ext) / C3;
    Cl3 = Last(Ext) / C3;
    Ff3 = From(Ext) / F3;
    Fl3 = Last(Ext) / F3;

    extent ExtentInBricks(Bf3, Bl3 - Bf3 + 1);
    extent ExtentInChunks(Cf3, Cl3 - Cf3 + 1);
    extent ExtentInFiles(Ff3, Fl3 - Ff3 + 1);

    extent VolExt(Idx2.Dims3);
    v3i Vbf3, Vbl3, Vcf3, Vcl3, Vff3, Vfl3; // VolBrickFirst, VolBrickLast
    Vbf3 = From(VolExt) / B3;
    Vbl3 = Last(VolExt) / B3;
    Vcf3 = From(VolExt) / C3;
    Vcl3 = Last(VolExt) / C3;
    Vff3 = From(VolExt) / F3;
    Vfl3 = Last(VolExt) / F3;

    extent VolExtentInBricks(Vbf3, Vbl3 - Vbf3 + 1);
    extent VolExtentInChunks(Vcf3, Vcl3 - Vcf3 + 1);
    extent VolExtentInFiles(Vff3, Vfl3 - Vff3 + 1);

    idx2_FileTraverse(
      //      u64 FileAddr = FileTop.Address;
      //      idx2_Assert(FileAddr == GetLinearFile(Idx2, Level, FileTop.FileFrom3));
      idx2_ChunkTraverse(
        //        u64 ChunkAddr = (FileAddr * Idx2.ChunksPerFiles[Level]) + ChunkTop.Address;
        //        idx2_Assert(ChunkAddr == GetLinearChunk(Idx2, Level, ChunkTop.ChunkFrom3));
        //D.ChunkInFile = ChunkTop.ChunkInFile;
        idx2_BrickTraverse(
          Ds.BrickInChunk = Top.BrickInChunk;
          //          u64 BrickAddr = (ChunkAddr * Idx2.BricksPerChunks[Level]) + Top.Address;
          //          idx2_Assert(BrickAddr == GetLinearBrick(Idx2, Level, Top.BrickFrom3));
          brick_volume BVol;
          Resize(&BVol.Vol, Idx2.BrickDimsExt3, dtype::float64, D.Alloc);
          // TODO: for progressive decompression, copy the data from BrickTable to BrickVol
          Fill(idx2_Range(f64, BVol.Vol), 0.0); // TODO: use memset
          Ds.Level = Level;
          Ds.Brick3 = Top.BrickFrom3;
          Ds.Brick = GetLinearBrick(Idx2, Level, Top.BrickFrom3);
          //printf("level = %d brick = %llu\n", Level, D.Brick[Level]);
          u64 BrickKey = GetBrickKey(Level, Ds.Brick);
          auto BrickIt = Insert(&D.BrickPool.BrickTable, BrickKey, BVol);
          // TODO: pass the brick iterator into the DecodeBrick function to avoid one extra lookup
          /* --------------- Decode the brick --------------- */
          idx2_PropagateIfError(DecodeBrick(Idx2, P, &D, Ds, Tolerance));
          // Copy the samples out to the output buffer (or file)
          // The Idx2.DecodeSubbandMasks[Level - 1] == 0 means that no subbands on the next level
          // will be decoded, so we can now just copy the result out
          /* -------------------- Copy wavelet inverse transform samples to the output --------------- */
          if (Level == 0 || Idx2.DecodeSubbandMasks[Level - 1] == 0)
          {// TODO: the 1 << level is only true for 1 transform pass per level
            grid BrickGrid(Top.BrickFrom3 * B3, Idx2.BrickDims3, v3i(1 << Level));
            grid OutBrickGrid = Crop(OutGrid, BrickGrid);
            grid BrickGridLocal = Relative(OutBrickGrid, BrickGrid);
            if (P.OutMode == params::out_mode::RegularGridFile ||
                P.OutMode == params::out_mode::RegularGridMem)
            {
              auto OutputVol = P.OutMode == params::out_mode::RegularGridFile ? &OutVol.Vol : &OutVolMem;
              auto CopyFunc = OutputVol->Type == dtype::float32 ? (CopyGridGrid<f64, f32>)
                                                                : (CopyGridGrid<f64, f64>);
              CopyFunc(BrickGridLocal, BVol.Vol, Relative(OutBrickGrid, OutGrid), OutputVol);
              Dealloc(&BVol);
              Delete(&D.BrickPool.BrickTable, BrickKey);
            }
            else if (P.OutMode == params::out_mode::HashMap)
            {
              //printf("deleting\n");
              if (!BrickIt.Val->Significant)
              {
                Dealloc(&BVol);
                // TODO: can we delete straight from the iterator?
                Delete(&D.BrickPool.BrickTable, BrickKey);
              }
            }
          },
          64,
          Idx2.BricksOrderInChunk[Level],
          ChunkTop.ChunkFrom3 * Idx2.BricksPerChunk3s[Level],
          Idx2.BricksPerChunk3s[Level],
          ExtentInBricks,
          VolExtentInBricks);
        ,
        64,
        Idx2.ChunksOrderInFile[Level],
        FileTop.FileFrom3 * Idx2.ChunksPerFile3s[Level],
        Idx2.ChunksPerFile3s[Level],
        ExtentInChunks,
        VolExtentInChunks);
      , 64, Idx2.FilesOrder[Level], v3i(0), Idx2.NFiles3[Level], ExtentInFiles, VolExtentInFiles);
  } // end level loop

  if (P.OutMode == params::out_mode::HashMap)
  {
    PrintStatistics(&D.BrickPool);
    ComputeBrickResolution(&D.BrickPool);
    WriteBricks(&D.BrickPool, "bricks");
  }

  printf("total decode time   = %f\n", Seconds(ElapsedTime(&DecodeTimer)));
  printf("io time             = %f\n", Seconds(D.DecodeIOTime_.load()));
  printf("data movement time  = %f\n", Seconds(D.DataMovementTime_.load()));
  printf("exp   bytes read    = %" PRIi64 "\n", D.BytesExps_.load());
  printf("data  bytes read    = %" PRIi64 "\n", D.BytesData_.load());
  printf("total bytes read    = %" PRIi64 "\n", D.BytesExps_.load() + D.BytesData_.load());
  printf("total bytes decoded = %" PRIi64 "\n", D.BytesDecoded_.load() / 8);
  printf("final size of brick hashmap = %" PRIi64 "\n", Size(D.BrickPool.BrickTable));
  printf("number of significant blocks = %" PRIi64 "\n", D.NSignificantBlocks.load());
  printf("number of insignificant subbands = %" PRIi64 "\n", D.NInsignificantSubbands.load());

  return idx2_Error(err_code::NoError);
}